

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersectorK<8,8>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx512::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined1 auVar15 [16];
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  int iVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [12];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  byte bVar59;
  byte bVar60;
  byte bVar61;
  ulong uVar62;
  uint uVar63;
  long lVar64;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar84 [16];
  ulong uVar65;
  byte bVar66;
  byte bVar67;
  byte bVar68;
  byte bVar69;
  long lVar70;
  bool bVar71;
  ulong uVar72;
  uint uVar73;
  uint uVar144;
  uint uVar145;
  uint uVar147;
  uint uVar148;
  uint uVar149;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  uint uVar146;
  uint uVar150;
  undefined1 auVar137 [32];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar138 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar143 [32];
  float pp;
  float fVar151;
  undefined4 uVar152;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  float fVar153;
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  float fVar209;
  float fVar210;
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [64];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  float fVar234;
  float fVar237;
  float fVar238;
  undefined1 auVar235 [16];
  float fVar239;
  float fVar240;
  float fVar241;
  undefined1 auVar236 [64];
  float fVar242;
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  float fVar246;
  float fVar247;
  float fVar248;
  undefined1 auVar245 [32];
  undefined1 auVar249 [64];
  float t;
  float fVar250;
  float fVar251;
  float fVar256;
  undefined1 auVar252 [16];
  float fVar254;
  float fVar255;
  float fVar257;
  undefined1 auVar253 [64];
  float s;
  undefined1 auVar258 [32];
  undefined1 auVar259 [64];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  bool local_ab9;
  float local_9e0;
  RTCFilterFunctionNArguments local_7b0;
  undefined1 local_780 [16];
  undefined1 local_770 [16];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [32];
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined1 local_6b0 [16];
  undefined1 local_6a0 [16];
  undefined1 local_690 [16];
  float local_680;
  float fStack_67c;
  float fStack_678;
  float fStack_674;
  undefined1 local_670 [16];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  undefined1 local_640 [16];
  Primitive *local_630;
  ulong local_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [8];
  float fStack_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float fStack_5a8;
  float fStack_5a4;
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  RTCHitN local_460 [32];
  undefined1 local_440 [32];
  undefined4 local_420;
  undefined4 uStack_41c;
  undefined4 uStack_418;
  undefined4 uStack_414;
  undefined4 uStack_410;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined4 uStack_404;
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [32];
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  undefined8 uStack_3a8;
  undefined1 local_3a0 [32];
  uint local_380;
  uint uStack_37c;
  uint uStack_378;
  uint uStack_374;
  uint uStack_370;
  uint uStack_36c;
  uint uStack_368;
  uint uStack_364;
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  undefined1 local_260 [32];
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  float fStack_224;
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  undefined1 local_1a0 [32];
  byte abStack_180 [32];
  uint auStack_160 [7];
  float fStack_144;
  undefined8 uStack_140;
  float afStack_138 [66];
  undefined1 auVar139 [32];
  undefined1 auVar142 [32];
  
  PVar2 = prim[1];
  uVar72 = (ulong)(byte)PVar2;
  lVar70 = uVar72 * 0x25;
  fVar210 = *(float *)(prim + lVar70 + 0x12);
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar74 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar79 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar80 = vsubps_avx(auVar74,*(undefined1 (*) [16])(prim + lVar70 + 6));
  fVar209 = fVar210 * auVar80._0_4_;
  fVar151 = fVar210 * auVar79._0_4_;
  auVar74._8_8_ = 0;
  auVar74._0_8_ = *(ulong *)(prim + uVar72 * 4 + 6);
  auVar88 = vpmovsxbd_avx2(auVar74);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar72 * 5 + 6);
  auVar89 = vpmovsxbd_avx2(auVar15);
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar72 * 6 + 6);
  auVar90 = vpmovsxbd_avx2(auVar76);
  auVar90 = vcvtdq2ps_avx(auVar90);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar72 * 0xf + 6);
  auVar91 = vpmovsxbd_avx2(auVar77);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar97 = vpmovsxbd_avx2(auVar84);
  auVar91 = vcvtdq2ps_avx(auVar91);
  auVar92 = vcvtdq2ps_avx(auVar97);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar72 + 6);
  auVar93 = vpmovsxbd_avx2(auVar159);
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar72 * 0x1a + 6);
  auVar94 = vpmovsxbd_avx2(auVar75);
  auVar94 = vcvtdq2ps_avx(auVar94);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar72 * 0x1b + 6);
  auVar95 = vpmovsxbd_avx2(auVar78);
  auVar95 = vcvtdq2ps_avx(auVar95);
  auVar252._8_8_ = 0;
  auVar252._0_8_ = *(ulong *)(prim + uVar72 * 0x1c + 6);
  auVar87 = vpmovsxbd_avx2(auVar252);
  auVar96 = vcvtdq2ps_avx(auVar87);
  auVar104._4_4_ = fVar151;
  auVar104._0_4_ = fVar151;
  auVar104._8_4_ = fVar151;
  auVar104._12_4_ = fVar151;
  auVar104._16_4_ = fVar151;
  auVar104._20_4_ = fVar151;
  auVar104._24_4_ = fVar151;
  auVar104._28_4_ = fVar151;
  auVar111._8_4_ = 1;
  auVar111._0_8_ = 0x100000001;
  auVar111._12_4_ = 1;
  auVar111._16_4_ = 1;
  auVar111._20_4_ = 1;
  auVar111._24_4_ = 1;
  auVar111._28_4_ = 1;
  auVar85 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar99 = ZEXT1632(CONCAT412(fVar210 * auVar79._12_4_,
                               CONCAT48(fVar210 * auVar79._8_4_,
                                        CONCAT44(fVar210 * auVar79._4_4_,fVar151))));
  auVar98 = vpermps_avx2(auVar111,auVar99);
  auVar86 = vpermps_avx512vl(auVar85,auVar99);
  fVar234 = auVar86._0_4_;
  fVar237 = auVar86._4_4_;
  auVar99._4_4_ = fVar237 * auVar90._4_4_;
  auVar99._0_4_ = fVar234 * auVar90._0_4_;
  fVar238 = auVar86._8_4_;
  auVar99._8_4_ = fVar238 * auVar90._8_4_;
  fVar239 = auVar86._12_4_;
  auVar99._12_4_ = fVar239 * auVar90._12_4_;
  fVar240 = auVar86._16_4_;
  auVar99._16_4_ = fVar240 * auVar90._16_4_;
  fVar241 = auVar86._20_4_;
  auVar99._20_4_ = fVar241 * auVar90._20_4_;
  fVar257 = auVar86._24_4_;
  auVar99._24_4_ = fVar257 * auVar90._24_4_;
  auVar99._28_4_ = auVar97._28_4_;
  auVar97._4_4_ = auVar93._4_4_ * fVar237;
  auVar97._0_4_ = auVar93._0_4_ * fVar234;
  auVar97._8_4_ = auVar93._8_4_ * fVar238;
  auVar97._12_4_ = auVar93._12_4_ * fVar239;
  auVar97._16_4_ = auVar93._16_4_ * fVar240;
  auVar97._20_4_ = auVar93._20_4_ * fVar241;
  auVar97._24_4_ = auVar93._24_4_ * fVar257;
  auVar97._28_4_ = auVar87._28_4_;
  auVar87._4_4_ = auVar96._4_4_ * fVar237;
  auVar87._0_4_ = auVar96._0_4_ * fVar234;
  auVar87._8_4_ = auVar96._8_4_ * fVar238;
  auVar87._12_4_ = auVar96._12_4_ * fVar239;
  auVar87._16_4_ = auVar96._16_4_ * fVar240;
  auVar87._20_4_ = auVar96._20_4_ * fVar241;
  auVar87._24_4_ = auVar96._24_4_ * fVar257;
  auVar87._28_4_ = auVar86._28_4_;
  auVar74 = vfmadd231ps_fma(auVar99,auVar98,auVar89);
  auVar15 = vfmadd231ps_fma(auVar97,auVar98,auVar92);
  auVar76 = vfmadd231ps_fma(auVar87,auVar95,auVar98);
  auVar74 = vfmadd231ps_fma(ZEXT1632(auVar74),auVar104,auVar88);
  auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar104,auVar91);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar94,auVar104);
  auVar110._4_4_ = fVar209;
  auVar110._0_4_ = fVar209;
  auVar110._8_4_ = fVar209;
  auVar110._12_4_ = fVar209;
  auVar110._16_4_ = fVar209;
  auVar110._20_4_ = fVar209;
  auVar110._24_4_ = fVar209;
  auVar110._28_4_ = fVar209;
  auVar87 = ZEXT1632(CONCAT412(fVar210 * auVar80._12_4_,
                               CONCAT48(fVar210 * auVar80._8_4_,
                                        CONCAT44(fVar210 * auVar80._4_4_,fVar209))));
  auVar97 = vpermps_avx2(auVar111,auVar87);
  auVar87 = vpermps_avx512vl(auVar85,auVar87);
  fVar210 = auVar87._0_4_;
  fVar234 = auVar87._4_4_;
  auVar98._4_4_ = fVar234 * auVar90._4_4_;
  auVar98._0_4_ = fVar210 * auVar90._0_4_;
  fVar237 = auVar87._8_4_;
  auVar98._8_4_ = fVar237 * auVar90._8_4_;
  fVar238 = auVar87._12_4_;
  auVar98._12_4_ = fVar238 * auVar90._12_4_;
  fVar239 = auVar87._16_4_;
  auVar98._16_4_ = fVar239 * auVar90._16_4_;
  fVar240 = auVar87._20_4_;
  auVar98._20_4_ = fVar240 * auVar90._20_4_;
  fVar241 = auVar87._24_4_;
  auVar98._24_4_ = fVar241 * auVar90._24_4_;
  auVar98._28_4_ = fVar151;
  auVar85._4_4_ = auVar93._4_4_ * fVar234;
  auVar85._0_4_ = auVar93._0_4_ * fVar210;
  auVar85._8_4_ = auVar93._8_4_ * fVar237;
  auVar85._12_4_ = auVar93._12_4_ * fVar238;
  auVar85._16_4_ = auVar93._16_4_ * fVar239;
  auVar85._20_4_ = auVar93._20_4_ * fVar240;
  auVar85._24_4_ = auVar93._24_4_ * fVar241;
  auVar85._28_4_ = auVar90._28_4_;
  auVar93._4_4_ = auVar96._4_4_ * fVar234;
  auVar93._0_4_ = auVar96._0_4_ * fVar210;
  auVar93._8_4_ = auVar96._8_4_ * fVar237;
  auVar93._12_4_ = auVar96._12_4_ * fVar238;
  auVar93._16_4_ = auVar96._16_4_ * fVar239;
  auVar93._20_4_ = auVar96._20_4_ * fVar240;
  auVar93._24_4_ = auVar96._24_4_ * fVar241;
  auVar93._28_4_ = auVar87._28_4_;
  auVar77 = vfmadd231ps_fma(auVar98,auVar97,auVar89);
  auVar84 = vfmadd231ps_fma(auVar85,auVar97,auVar92);
  auVar159 = vfmadd231ps_fma(auVar93,auVar97,auVar95);
  auVar79 = vfmadd231ps_fma(ZEXT1632(auVar77),auVar110,auVar88);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar84),auVar110,auVar91);
  auVar88 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar263 = ZEXT3264(auVar88);
  auVar81 = vfmadd231ps_fma(ZEXT1632(auVar159),auVar110,auVar94);
  vandps_avx512vl(ZEXT1632(auVar74),auVar88);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar107._16_4_ = 0x219392ef;
  auVar107._20_4_ = 0x219392ef;
  auVar107._24_4_ = 0x219392ef;
  auVar107._28_4_ = 0x219392ef;
  uVar62 = vcmpps_avx512vl(auVar88,auVar107,1);
  bVar71 = (bool)((byte)uVar62 & 1);
  auVar86._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._0_4_;
  bVar71 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar86._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._4_4_;
  bVar71 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar86._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._8_4_;
  bVar71 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar86._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar74._12_4_;
  auVar86._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar86._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar86._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar86._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar15),auVar88);
  uVar62 = vcmpps_avx512vl(auVar86,auVar107,1);
  bVar71 = (bool)((byte)uVar62 & 1);
  auVar100._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar15._0_4_;
  bVar71 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar100._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar15._4_4_;
  bVar71 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar100._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar15._8_4_;
  bVar71 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar100._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar15._12_4_;
  auVar100._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar100._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar100._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar100._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  vandps_avx512vl(ZEXT1632(auVar76),auVar88);
  uVar62 = vcmpps_avx512vl(auVar100,auVar107,1);
  bVar71 = (bool)((byte)uVar62 & 1);
  auVar88._0_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._0_4_;
  bVar71 = (bool)((byte)(uVar62 >> 1) & 1);
  auVar88._4_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._4_4_;
  bVar71 = (bool)((byte)(uVar62 >> 2) & 1);
  auVar88._8_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._8_4_;
  bVar71 = (bool)((byte)(uVar62 >> 3) & 1);
  auVar88._12_4_ = (uint)bVar71 * 0x219392ef | (uint)!bVar71 * auVar76._12_4_;
  auVar88._16_4_ = (uint)((byte)(uVar62 >> 4) & 1) * 0x219392ef;
  auVar88._20_4_ = (uint)((byte)(uVar62 >> 5) & 1) * 0x219392ef;
  auVar88._24_4_ = (uint)((byte)(uVar62 >> 6) & 1) * 0x219392ef;
  auVar88._28_4_ = (uint)(byte)(uVar62 >> 7) * 0x219392ef;
  auVar89 = vrcp14ps_avx512vl(auVar86);
  auVar109._8_4_ = 0x3f800000;
  auVar109._0_8_ = &DAT_3f8000003f800000;
  auVar109._12_4_ = 0x3f800000;
  auVar109._16_4_ = 0x3f800000;
  auVar109._20_4_ = 0x3f800000;
  auVar109._24_4_ = 0x3f800000;
  auVar109._28_4_ = 0x3f800000;
  auVar74 = vfnmadd213ps_fma(auVar86,auVar89,auVar109);
  auVar74 = vfmadd132ps_fma(ZEXT1632(auVar74),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar100);
  auVar15 = vfnmadd213ps_fma(auVar100,auVar89,auVar109);
  auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar89,auVar89);
  auVar89 = vrcp14ps_avx512vl(auVar88);
  auVar76 = vfnmadd213ps_fma(auVar88,auVar89,auVar109);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar89,auVar89);
  fVar210 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar70 + 0x16)) *
            *(float *)(prim + lVar70 + 0x1a);
  auVar105._4_4_ = fVar210;
  auVar105._0_4_ = fVar210;
  auVar105._8_4_ = fVar210;
  auVar105._12_4_ = fVar210;
  auVar105._16_4_ = fVar210;
  auVar105._20_4_ = fVar210;
  auVar105._24_4_ = fVar210;
  auVar105._28_4_ = fVar210;
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 7 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xb + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar90 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 9 + 6));
  auVar77 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vcvtdq2ps_avx(auVar90);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0xd + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar84 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x12 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  uVar62 = (ulong)(uint)((int)(uVar72 * 5) << 2);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 2 + uVar62 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar159 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar62 + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x18 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar75 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x1d + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 + (ulong)(byte)PVar2 * 0x20 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar78 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + ((ulong)(byte)PVar2 * 0x20 - uVar72) + 6));
  auVar88 = vcvtdq2ps_avx(auVar88);
  auVar89 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar72 * 0x23 + 6));
  auVar89 = vcvtdq2ps_avx(auVar89);
  auVar89 = vsubps_avx(auVar89,auVar88);
  auVar252 = vfmadd213ps_fma(auVar89,auVar105,auVar88);
  auVar88 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar79));
  auVar94._4_4_ = auVar74._4_4_ * auVar88._4_4_;
  auVar94._0_4_ = auVar74._0_4_ * auVar88._0_4_;
  auVar94._8_4_ = auVar74._8_4_ * auVar88._8_4_;
  auVar94._12_4_ = auVar74._12_4_ * auVar88._12_4_;
  auVar94._16_4_ = auVar88._16_4_ * 0.0;
  auVar94._20_4_ = auVar88._20_4_ * 0.0;
  auVar94._24_4_ = auVar88._24_4_ * 0.0;
  auVar94._28_4_ = auVar88._28_4_;
  auVar88 = vsubps_avx(ZEXT1632(auVar84),ZEXT1632(auVar79));
  auVar103._0_4_ = auVar74._0_4_ * auVar88._0_4_;
  auVar103._4_4_ = auVar74._4_4_ * auVar88._4_4_;
  auVar103._8_4_ = auVar74._8_4_ * auVar88._8_4_;
  auVar103._12_4_ = auVar74._12_4_ * auVar88._12_4_;
  auVar103._16_4_ = auVar88._16_4_ * 0.0;
  auVar103._20_4_ = auVar88._20_4_ * 0.0;
  auVar103._24_4_ = auVar88._24_4_ * 0.0;
  auVar103._28_4_ = 0;
  auVar88 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar80));
  auVar95._4_4_ = auVar15._4_4_ * auVar88._4_4_;
  auVar95._0_4_ = auVar15._0_4_ * auVar88._0_4_;
  auVar95._8_4_ = auVar15._8_4_ * auVar88._8_4_;
  auVar95._12_4_ = auVar15._12_4_ * auVar88._12_4_;
  auVar95._16_4_ = auVar88._16_4_ * 0.0;
  auVar95._20_4_ = auVar88._20_4_ * 0.0;
  auVar95._24_4_ = auVar88._24_4_ * 0.0;
  auVar95._28_4_ = auVar88._28_4_;
  auVar88 = vsubps_avx(ZEXT1632(auVar75),ZEXT1632(auVar80));
  auVar102._0_4_ = auVar15._0_4_ * auVar88._0_4_;
  auVar102._4_4_ = auVar15._4_4_ * auVar88._4_4_;
  auVar102._8_4_ = auVar15._8_4_ * auVar88._8_4_;
  auVar102._12_4_ = auVar15._12_4_ * auVar88._12_4_;
  auVar102._16_4_ = auVar88._16_4_ * 0.0;
  auVar102._20_4_ = auVar88._20_4_ * 0.0;
  auVar102._24_4_ = auVar88._24_4_ * 0.0;
  auVar102._28_4_ = 0;
  auVar88 = vsubps_avx(ZEXT1632(auVar78),ZEXT1632(auVar81));
  auVar96._4_4_ = auVar76._4_4_ * auVar88._4_4_;
  auVar96._0_4_ = auVar76._0_4_ * auVar88._0_4_;
  auVar96._8_4_ = auVar76._8_4_ * auVar88._8_4_;
  auVar96._12_4_ = auVar76._12_4_ * auVar88._12_4_;
  auVar96._16_4_ = auVar88._16_4_ * 0.0;
  auVar96._20_4_ = auVar88._20_4_ * 0.0;
  auVar96._24_4_ = auVar88._24_4_ * 0.0;
  auVar96._28_4_ = auVar88._28_4_;
  auVar88 = vsubps_avx(ZEXT1632(auVar252),ZEXT1632(auVar81));
  auVar101._0_4_ = auVar76._0_4_ * auVar88._0_4_;
  auVar101._4_4_ = auVar76._4_4_ * auVar88._4_4_;
  auVar101._8_4_ = auVar76._8_4_ * auVar88._8_4_;
  auVar101._12_4_ = auVar76._12_4_ * auVar88._12_4_;
  auVar101._16_4_ = auVar88._16_4_ * 0.0;
  auVar101._20_4_ = auVar88._20_4_ * 0.0;
  auVar101._24_4_ = auVar88._24_4_ * 0.0;
  auVar101._28_4_ = 0;
  auVar88 = vpminsd_avx2(auVar94,auVar103);
  auVar89 = vpminsd_avx2(auVar95,auVar102);
  auVar88 = vmaxps_avx(auVar88,auVar89);
  auVar89 = vpminsd_avx2(auVar96,auVar101);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar90._4_4_ = uVar152;
  auVar90._0_4_ = uVar152;
  auVar90._8_4_ = uVar152;
  auVar90._12_4_ = uVar152;
  auVar90._16_4_ = uVar152;
  auVar90._20_4_ = uVar152;
  auVar90._24_4_ = uVar152;
  auVar90._28_4_ = uVar152;
  auVar89 = vmaxps_avx512vl(auVar89,auVar90);
  auVar88 = vmaxps_avx(auVar88,auVar89);
  auVar89._8_4_ = 0x3f7ffffa;
  auVar89._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar89._12_4_ = 0x3f7ffffa;
  auVar89._16_4_ = 0x3f7ffffa;
  auVar89._20_4_ = 0x3f7ffffa;
  auVar89._24_4_ = 0x3f7ffffa;
  auVar89._28_4_ = 0x3f7ffffa;
  local_2e0 = vmulps_avx512vl(auVar88,auVar89);
  auVar88 = vpmaxsd_avx2(auVar94,auVar103);
  auVar89 = vpmaxsd_avx2(auVar95,auVar102);
  auVar88 = vminps_avx(auVar88,auVar89);
  auVar89 = vpmaxsd_avx2(auVar96,auVar101);
  uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar91._4_4_ = uVar152;
  auVar91._0_4_ = uVar152;
  auVar91._8_4_ = uVar152;
  auVar91._12_4_ = uVar152;
  auVar91._16_4_ = uVar152;
  auVar91._20_4_ = uVar152;
  auVar91._24_4_ = uVar152;
  auVar91._28_4_ = uVar152;
  auVar89 = vminps_avx512vl(auVar89,auVar91);
  auVar88 = vminps_avx(auVar88,auVar89);
  auVar92._8_4_ = 0x3f800003;
  auVar92._0_8_ = 0x3f8000033f800003;
  auVar92._12_4_ = 0x3f800003;
  auVar92._16_4_ = 0x3f800003;
  auVar92._20_4_ = 0x3f800003;
  auVar92._24_4_ = 0x3f800003;
  auVar92._28_4_ = 0x3f800003;
  auVar88 = vmulps_avx512vl(auVar88,auVar92);
  auVar89 = vpbroadcastd_avx512vl();
  uVar18 = vpcmpgtd_avx512vl(auVar89,_DAT_0205a920);
  uVar16 = vcmpps_avx512vl(local_2e0,auVar88,2);
  bVar71 = (byte)((byte)uVar16 & (byte)uVar18) == 0;
  local_ab9 = !bVar71;
  if (bVar71) {
    return local_ab9;
  }
  local_628 = (ulong)(byte)((byte)uVar16 & (byte)uVar18);
  local_520 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_630 = prim;
LAB_01f1235c:
  lVar70 = 0;
  for (uVar62 = local_628; (uVar62 & 1) == 0; uVar62 = uVar62 >> 1 | 0x8000000000000000) {
    lVar70 = lVar70 + 1;
  }
  uVar63 = *(uint *)(local_630 + 2);
  pGVar3 = (context->scene->geometries).items[uVar63].ptr;
  uVar62 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_630 + lVar70 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar210 = (pGVar3->time_range).lower;
  fVar210 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar210) / ((pGVar3->time_range).upper - fVar210));
  auVar74 = vroundss_avx(ZEXT416((uint)fVar210),ZEXT416((uint)fVar210),9);
  auVar74 = vminss_avx(auVar74,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar74 = vmaxss_avx(ZEXT816(0) << 0x20,auVar74);
  fVar210 = fVar210 - auVar74._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar64 = (long)(int)auVar74._0_4_ * 0x38;
  lVar70 = *(long *)(_Var4 + 0x10 + lVar64);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar64);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar64);
  pfVar1 = (float *)(lVar5 + uVar62 * lVar6);
  auVar80._0_4_ = fVar210 * *pfVar1;
  auVar80._4_4_ = fVar210 * pfVar1[1];
  auVar80._8_4_ = fVar210 * pfVar1[2];
  auVar80._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 1) * lVar6);
  auVar81._0_4_ = fVar210 * *pfVar1;
  auVar81._4_4_ = fVar210 * pfVar1[1];
  auVar81._8_4_ = fVar210 * pfVar1[2];
  auVar81._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar62 + 2) * lVar6);
  auVar82._0_4_ = fVar210 * *pfVar1;
  auVar82._4_4_ = fVar210 * pfVar1[1];
  auVar82._8_4_ = fVar210 * pfVar1[2];
  auVar82._12_4_ = fVar210 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar62 + 3));
  auVar224._0_4_ = fVar210 * *pfVar1;
  auVar224._4_4_ = fVar210 * pfVar1[1];
  auVar224._8_4_ = fVar210 * pfVar1[2];
  auVar224._12_4_ = fVar210 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar64);
  fVar210 = 1.0 - fVar210;
  auVar83._4_4_ = fVar210;
  auVar83._0_4_ = fVar210;
  auVar83._8_4_ = fVar210;
  auVar83._12_4_ = fVar210;
  auVar76 = vfmadd231ps_fma(auVar80,auVar83,*(undefined1 (*) [16])(lVar5 + lVar70 * uVar62));
  auVar77 = vfmadd231ps_fma(auVar81,auVar83,*(undefined1 (*) [16])(lVar5 + lVar70 * (uVar62 + 1)));
  auVar84 = vfmadd231ps_fma(auVar82,auVar83,*(undefined1 (*) [16])(lVar5 + lVar70 * (uVar62 + 2)));
  auVar74 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar74,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_4e0 = vpbroadcastd_avx512vl();
  auVar88 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x80)));
  auVar89 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0xa0)));
  auVar74 = vunpcklps_avx512vl(auVar88._0_16_,auVar89._0_16_);
  fVar210 = *(float *)(ray + k * 4 + 0xc0);
  auVar262._4_4_ = fVar210;
  auVar262._0_4_ = fVar210;
  auVar262._8_4_ = fVar210;
  auVar262._12_4_ = fVar210;
  local_480._16_4_ = fVar210;
  local_480._0_16_ = auVar262;
  local_480._20_4_ = fVar210;
  local_480._24_4_ = fVar210;
  local_480._28_4_ = fVar210;
  local_770 = vinsertps_avx(auVar74,auVar262,0x28);
  fVar151 = *(float *)(ray + k * 4 + 0x60);
  auVar259 = ZEXT464((uint)fVar151);
  auVar235._0_4_ = auVar76._0_4_ + auVar77._0_4_;
  auVar235._4_4_ = auVar76._4_4_ + auVar77._4_4_;
  auVar235._8_4_ = auVar76._8_4_ + auVar77._8_4_;
  auVar235._12_4_ = auVar76._12_4_ + auVar77._12_4_;
  auVar79._8_4_ = 0x3f000000;
  auVar79._0_8_ = 0x3f0000003f000000;
  auVar79._12_4_ = 0x3f000000;
  auVar74 = vmulps_avx512vl(auVar235,auVar79);
  auVar74 = vsubps_avx(auVar74,auVar15);
  auVar74 = vdpps_avx(auVar74,local_770,0x7f);
  local_780 = vdpps_avx(local_770,local_770,0x7f);
  auVar78 = ZEXT816(0) << 0x40;
  auVar253 = ZEXT1664(auVar78);
  auVar243._4_12_ = ZEXT812(0) << 0x20;
  auVar243._0_4_ = local_780._0_4_;
  auVar75 = vrcp14ss_avx512f(auVar78,auVar243);
  auVar159 = vfnmadd213ss_fma(auVar75,local_780,ZEXT416(0x40000000));
  local_280 = auVar74._0_4_ * auVar159._0_4_ * auVar75._0_4_;
  auVar236 = ZEXT464((uint)local_280);
  auVar244._4_4_ = local_280;
  auVar244._0_4_ = local_280;
  auVar244._8_4_ = local_280;
  auVar244._12_4_ = local_280;
  fStack_5b0 = local_280;
  _local_5c0 = auVar244;
  fStack_5ac = local_280;
  fStack_5a8 = local_280;
  fStack_5a4 = local_280;
  auVar74 = vfmadd231ps_fma(auVar15,local_770,auVar244);
  auVar74 = vblendps_avx(auVar74,auVar78,8);
  auVar15 = vsubps_avx(auVar76,auVar74);
  auVar76 = vsubps_avx(auVar84,auVar74);
  auVar249 = ZEXT1664(auVar76);
  auVar84 = vfmadd231ps_fma(auVar224,auVar83,*(undefined1 (*) [16])(lVar5 + lVar70 * (uVar62 + 3)));
  auVar77 = vsubps_avx(auVar77,auVar74);
  auVar74 = vsubps_avx(auVar84,auVar74);
  auVar90 = vbroadcastss_avx512vl(auVar15);
  auVar112._8_4_ = 1;
  auVar112._0_8_ = 0x100000001;
  auVar112._12_4_ = 1;
  auVar112._16_4_ = 1;
  auVar112._20_4_ = 1;
  auVar112._24_4_ = 1;
  auVar112._28_4_ = 1;
  local_700 = ZEXT1632(auVar15);
  auVar91 = vpermps_avx512vl(auVar112,local_700);
  auVar113._8_4_ = 2;
  auVar113._0_8_ = 0x200000002;
  auVar113._12_4_ = 2;
  auVar113._16_4_ = 2;
  auVar113._20_4_ = 2;
  auVar113._24_4_ = 2;
  auVar113._28_4_ = 2;
  auVar92 = vpermps_avx512vl(auVar113,local_700);
  auVar114._8_4_ = 3;
  auVar114._0_8_ = 0x300000003;
  auVar114._12_4_ = 3;
  auVar114._16_4_ = 3;
  auVar114._20_4_ = 3;
  auVar114._24_4_ = 3;
  auVar114._28_4_ = 3;
  auVar93 = vpermps_avx512vl(auVar114,local_700);
  auVar94 = vbroadcastss_avx512vl(auVar77);
  local_740 = ZEXT1632(auVar77);
  auVar95 = vpermps_avx512vl(auVar112,local_740);
  auVar96 = vpermps_avx512vl(auVar113,local_740);
  auVar97 = vpermps_avx512vl(auVar114,local_740);
  auVar87 = vbroadcastss_avx512vl(auVar76);
  local_720 = ZEXT1632(auVar76);
  auVar98 = vpermps_avx512vl(auVar112,local_720);
  local_1e0 = vpermps_avx2(auVar113,local_720);
  local_200 = vpermps_avx2(auVar114,local_720);
  local_2a0 = vbroadcastss_avx512vl(auVar74);
  _local_760 = ZEXT1632(auVar74);
  local_2c0 = vpermps_avx512vl(auVar112,_local_760);
  local_220 = vpermps_avx2(auVar113,_local_760);
  _local_240 = vpermps_avx2(auVar114,_local_760);
  auVar99 = vfmadd231ps_avx512vl(ZEXT432((uint)(fVar210 * fVar210)),auVar89,auVar89);
  local_4a0 = vfmadd231ps_avx512vl(auVar99,auVar88,auVar88);
  uVar152 = local_4a0._0_4_;
  local_260._4_4_ = uVar152;
  local_260._0_4_ = uVar152;
  local_260._8_4_ = uVar152;
  local_260._12_4_ = uVar152;
  local_260._16_4_ = uVar152;
  local_260._20_4_ = uVar152;
  local_260._24_4_ = uVar152;
  local_260._28_4_ = uVar152;
  vandps_avx512vl(local_260,auVar263._0_32_);
  local_690 = ZEXT416((uint)local_280);
  local_280 = fVar151 - local_280;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  bVar68 = 0;
  fVar210 = 1.4013e-45;
  local_500 = vpbroadcastd_avx512vl();
  auVar74 = vsqrtss_avx(local_780,local_780);
  auVar15 = vsqrtss_avx(local_780,local_780);
  local_6b0 = ZEXT816(0x3f80000000000000);
  auVar223 = ZEXT3264(CONCAT428(0x3f800000,
                                CONCAT424(0x3f800000,
                                          CONCAT420(0x3f800000,
                                                    CONCAT416(0x3f800000,
                                                              CONCAT412(0x3f800000,
                                                                        CONCAT48(0x3f800000,
                                                                                 &
                                                  DAT_3f8000003f800000)))))));
  uVar62 = 0;
  do {
    auVar76 = vmovshdup_avx(local_6b0);
    fVar234 = local_6b0._0_4_;
    fVar251 = auVar76._0_4_ - fVar234;
    fVar209 = fVar251 * 0.04761905;
    auVar229._4_4_ = fVar234;
    auVar229._0_4_ = fVar234;
    auVar229._8_4_ = fVar234;
    auVar229._12_4_ = fVar234;
    auVar229._16_4_ = fVar234;
    auVar229._20_4_ = fVar234;
    auVar229._24_4_ = fVar234;
    auVar229._28_4_ = fVar234;
    auVar163._4_4_ = fVar251;
    auVar163._0_4_ = fVar251;
    auVar163._8_4_ = fVar251;
    auVar163._12_4_ = fVar251;
    auVar163._16_4_ = fVar251;
    auVar163._20_4_ = fVar251;
    auVar163._24_4_ = fVar251;
    auVar163._28_4_ = fVar251;
    auVar76 = vfmadd231ps_fma(auVar229,auVar163,_DAT_02020f20);
    auVar99 = vsubps_avx(auVar223._0_32_,ZEXT1632(auVar76));
    fVar234 = auVar76._0_4_;
    fVar237 = auVar76._4_4_;
    fVar238 = auVar76._8_4_;
    fVar239 = auVar76._12_4_;
    fVar240 = auVar99._0_4_;
    fVar241 = auVar99._4_4_;
    fVar257 = auVar99._8_4_;
    fVar242 = auVar99._12_4_;
    fVar153 = auVar99._16_4_;
    fVar246 = auVar99._20_4_;
    fVar247 = auVar99._24_4_;
    auVar120._4_4_ = fVar241 * fVar241 * -fVar237;
    auVar120._0_4_ = fVar240 * fVar240 * -fVar234;
    auVar120._8_4_ = fVar257 * fVar257 * -fVar238;
    auVar120._12_4_ = fVar242 * fVar242 * -fVar239;
    auVar120._16_4_ = fVar153 * fVar153 * -0.0;
    auVar120._20_4_ = fVar246 * fVar246 * -0.0;
    auVar120._24_4_ = fVar247 * fVar247 * -0.0;
    auVar120._28_4_ = 0x80000000;
    auVar263._28_36_ = auVar236._28_36_;
    auVar263._0_28_ =
         ZEXT1628(CONCAT412(fVar239 * fVar239,
                            CONCAT48(fVar238 * fVar238,CONCAT44(fVar237 * fVar237,fVar234 * fVar234)
                                    )));
    fVar250 = fVar234 * 3.0;
    fVar254 = fVar237 * 3.0;
    fVar255 = fVar238 * 3.0;
    fVar256 = fVar239 * 3.0;
    auVar223._28_36_ = auVar253._28_36_;
    auVar223._0_28_ = ZEXT1628(CONCAT412(fVar256,CONCAT48(fVar255,CONCAT44(fVar254,fVar250))));
    auVar187._0_4_ = (fVar250 + -5.0) * fVar234 * fVar234 + 2.0;
    auVar187._4_4_ = (fVar254 + -5.0) * fVar237 * fVar237 + 2.0;
    auVar187._8_4_ = (fVar255 + -5.0) * fVar238 * fVar238 + 2.0;
    auVar187._12_4_ = (fVar256 + -5.0) * fVar239 * fVar239 + 2.0;
    auVar187._16_4_ = 0x40000000;
    auVar187._20_4_ = 0x40000000;
    auVar187._24_4_ = 0x40000000;
    auVar187._28_4_ = 0x40000000;
    auVar236._0_4_ = fVar240 * fVar240;
    auVar236._4_4_ = fVar241 * fVar241;
    auVar236._8_4_ = fVar257 * fVar257;
    auVar236._12_4_ = fVar242 * fVar242;
    auVar236._16_4_ = fVar153 * fVar153;
    auVar236._20_4_ = fVar246 * fVar246;
    auVar236._28_36_ = auVar259._28_36_;
    auVar236._24_4_ = fVar247 * fVar247;
    auVar205._0_4_ = auVar236._0_4_ * (fVar240 * 3.0 + -5.0) + 2.0;
    auVar205._4_4_ = auVar236._4_4_ * (fVar241 * 3.0 + -5.0) + 2.0;
    auVar205._8_4_ = auVar236._8_4_ * (fVar257 * 3.0 + -5.0) + 2.0;
    auVar205._12_4_ = auVar236._12_4_ * (fVar242 * 3.0 + -5.0) + 2.0;
    auVar205._16_4_ = auVar236._16_4_ * (fVar153 * 3.0 + -5.0) + 2.0;
    auVar205._20_4_ = auVar236._20_4_ * (fVar246 * 3.0 + -5.0) + 2.0;
    auVar205._24_4_ = auVar236._24_4_ * (fVar247 * 3.0 + -5.0) + 2.0;
    auVar205._28_4_ = auVar249._28_4_ + -5.0 + 2.0;
    fVar248 = auVar99._28_4_;
    auVar122._4_4_ = fVar237 * fVar237 * -fVar241;
    auVar122._0_4_ = fVar234 * fVar234 * -fVar240;
    auVar122._8_4_ = fVar238 * fVar238 * -fVar257;
    auVar122._12_4_ = fVar239 * fVar239 * -fVar242;
    auVar122._16_4_ = -fVar153 * 0.0 * 0.0;
    auVar122._20_4_ = -fVar246 * 0.0 * 0.0;
    auVar122._24_4_ = -fVar247 * 0.0 * 0.0;
    auVar122._28_4_ = -fVar248;
    auVar100 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
    auVar99 = vmulps_avx512vl(auVar120,auVar100);
    auVar85 = vmulps_avx512vl(auVar187,auVar100);
    auVar86 = vmulps_avx512vl(auVar205,auVar100);
    auVar101 = vmulps_avx512vl(auVar122,auVar100);
    auVar102 = vmulps_avx512vl(local_2a0,auVar101);
    auVar103 = vmulps_avx512vl(local_2c0,auVar101);
    auVar104 = vmulps_avx512vl(local_220,auVar101);
    auVar123._4_4_ = (float)local_240._4_4_ * auVar101._4_4_;
    auVar123._0_4_ = (float)local_240._0_4_ * auVar101._0_4_;
    auVar123._8_4_ = fStack_238 * auVar101._8_4_;
    auVar123._12_4_ = fStack_234 * auVar101._12_4_;
    auVar123._16_4_ = fStack_230 * auVar101._16_4_;
    auVar123._20_4_ = fStack_22c * auVar101._20_4_;
    auVar123._24_4_ = fStack_228 * auVar101._24_4_;
    auVar123._28_4_ = auVar101._28_4_;
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar86,auVar87);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar86,auVar98);
    auVar103 = vfmadd231ps_avx512vl(auVar104,auVar86,local_1e0);
    auVar76 = vfmadd231ps_fma(auVar123,local_200,auVar86);
    auVar86 = vfmadd231ps_avx512vl(auVar101,auVar85,auVar94);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar85,auVar95);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar85,auVar96);
    auVar103 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar97,auVar85);
    auVar104 = vfmadd231ps_avx512vl(auVar86,auVar99,auVar90);
    local_5e0 = vfmadd231ps_avx512vl(auVar101,auVar99,auVar91);
    auVar101 = vfmadd231ps_avx512vl(auVar102,auVar99,auVar92);
    auVar102 = vfmadd231ps_avx512vl(auVar103,auVar93,auVar99);
    auVar124._4_4_ = (fVar241 + fVar241) * fVar237;
    auVar124._0_4_ = (fVar240 + fVar240) * fVar234;
    auVar124._8_4_ = (fVar257 + fVar257) * fVar238;
    auVar124._12_4_ = (fVar242 + fVar242) * fVar239;
    auVar124._16_4_ = (fVar153 + fVar153) * 0.0;
    auVar124._20_4_ = (fVar246 + fVar246) * 0.0;
    auVar124._24_4_ = (fVar247 + fVar247) * 0.0;
    auVar124._28_4_ = auVar85._28_4_;
    auVar99 = vsubps_avx(auVar124,auVar236._0_32_);
    auVar230._0_28_ =
         ZEXT1628(CONCAT412((fVar239 + fVar239) * (fVar256 + -5.0) + fVar256 * fVar239,
                            CONCAT48((fVar238 + fVar238) * (fVar255 + -5.0) + fVar255 * fVar238,
                                     CONCAT44((fVar237 + fVar237) * (fVar254 + -5.0) +
                                              fVar254 * fVar237,
                                              (fVar234 + fVar234) * (fVar250 + -5.0) +
                                              fVar250 * fVar234))));
    auVar230._28_4_ = auVar253._28_4_ + -5.0 + 0.0;
    auVar115._8_4_ = 0x40000000;
    auVar115._0_8_ = 0x4000000040000000;
    auVar115._12_4_ = 0x40000000;
    auVar115._16_4_ = 0x40000000;
    auVar115._20_4_ = 0x40000000;
    auVar115._24_4_ = 0x40000000;
    auVar115._28_4_ = 0x40000000;
    auVar85 = vaddps_avx512vl(auVar223._0_32_,auVar115);
    auVar127._4_4_ = (fVar241 + fVar241) * auVar85._4_4_;
    auVar127._0_4_ = (fVar240 + fVar240) * auVar85._0_4_;
    auVar127._8_4_ = (fVar257 + fVar257) * auVar85._8_4_;
    auVar127._12_4_ = (fVar242 + fVar242) * auVar85._12_4_;
    auVar127._16_4_ = (fVar153 + fVar153) * auVar85._16_4_;
    auVar127._20_4_ = (fVar246 + fVar246) * auVar85._20_4_;
    auVar127._24_4_ = (fVar247 + fVar247) * auVar85._24_4_;
    auVar127._28_4_ = auVar85._28_4_;
    auVar128._4_4_ = fVar241 * 3.0 * fVar241;
    auVar128._0_4_ = fVar240 * 3.0 * fVar240;
    auVar128._8_4_ = fVar257 * 3.0 * fVar257;
    auVar128._12_4_ = fVar242 * 3.0 * fVar242;
    auVar128._16_4_ = fVar153 * 3.0 * fVar153;
    auVar128._20_4_ = fVar246 * 3.0 * fVar246;
    auVar128._24_4_ = fVar247 * 3.0 * fVar247;
    auVar128._28_4_ = fVar248;
    auVar85 = vsubps_avx(auVar127,auVar128);
    auVar86 = vsubps_avx(auVar263._0_32_,auVar124);
    auVar103 = vmulps_avx512vl(auVar99,auVar100);
    auVar105 = vmulps_avx512vl(auVar230,auVar100);
    auVar85 = vmulps_avx512vl(auVar85,auVar100);
    auVar86 = vmulps_avx512vl(auVar86,auVar100);
    auVar100 = vmulps_avx512vl(local_2a0,auVar86);
    fVar234 = auVar86._0_4_;
    fVar237 = auVar86._4_4_;
    auVar129._4_4_ = local_2c0._4_4_ * fVar237;
    auVar129._0_4_ = local_2c0._0_4_ * fVar234;
    fVar238 = auVar86._8_4_;
    auVar129._8_4_ = local_2c0._8_4_ * fVar238;
    fVar239 = auVar86._12_4_;
    auVar129._12_4_ = local_2c0._12_4_ * fVar239;
    fVar240 = auVar86._16_4_;
    auVar129._16_4_ = local_2c0._16_4_ * fVar240;
    fVar241 = auVar86._20_4_;
    auVar129._20_4_ = local_2c0._20_4_ * fVar241;
    fVar257 = auVar86._24_4_;
    auVar129._24_4_ = local_2c0._24_4_ * fVar257;
    auVar129._28_4_ = local_2c0._28_4_;
    auVar130._4_4_ = fVar237 * local_220._4_4_;
    auVar130._0_4_ = fVar234 * local_220._0_4_;
    auVar130._8_4_ = fVar238 * local_220._8_4_;
    auVar130._12_4_ = fVar239 * local_220._12_4_;
    auVar130._16_4_ = fVar240 * local_220._16_4_;
    auVar130._20_4_ = fVar241 * local_220._20_4_;
    auVar130._24_4_ = fVar257 * local_220._24_4_;
    auVar130._28_4_ = fVar248 + fVar248;
    auVar35._4_4_ = fVar237 * (float)local_240._4_4_;
    auVar35._0_4_ = fVar234 * (float)local_240._0_4_;
    auVar35._8_4_ = fVar238 * fStack_238;
    auVar35._12_4_ = fVar239 * fStack_234;
    auVar35._16_4_ = fVar240 * fStack_230;
    auVar35._20_4_ = fVar241 * fStack_22c;
    auVar35._24_4_ = fVar257 * fStack_228;
    auVar35._28_4_ = auVar86._28_4_;
    auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar86 = vfmadd231ps_avx512vl(auVar100,auVar85,auVar87);
    auVar100 = vfmadd231ps_avx512vl(auVar129,auVar85,auVar98);
    auVar107 = vfmadd231ps_avx512vl(auVar130,auVar85,local_1e0);
    auVar76 = vfmadd231ps_fma(auVar35,local_200,auVar85);
    auVar85 = vfmadd231ps_avx512vl(auVar86,auVar105,auVar94);
    auVar86 = vfmadd231ps_avx512vl(auVar100,auVar105,auVar95);
    auVar100 = vfmadd231ps_avx512vl(auVar107,auVar105,auVar96);
    auVar105 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar97,auVar105);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar103,auVar90);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar103,auVar91);
    auVar100 = vfmadd231ps_avx512vl(auVar100,auVar103,auVar92);
    auVar103 = vfmadd231ps_avx512vl(auVar105,auVar93,auVar103);
    auVar133._4_4_ = auVar85._4_4_ * fVar209;
    auVar133._0_4_ = auVar85._0_4_ * fVar209;
    auVar133._8_4_ = auVar85._8_4_ * fVar209;
    auVar133._12_4_ = auVar85._12_4_ * fVar209;
    auVar133._16_4_ = auVar85._16_4_ * fVar209;
    auVar133._20_4_ = auVar85._20_4_ * fVar209;
    auVar133._24_4_ = auVar85._24_4_ * fVar209;
    auVar133._28_4_ = auVar99._28_4_;
    auVar36._4_4_ = auVar86._4_4_ * fVar209;
    auVar36._0_4_ = auVar86._0_4_ * fVar209;
    auVar36._8_4_ = auVar86._8_4_ * fVar209;
    auVar36._12_4_ = auVar86._12_4_ * fVar209;
    auVar36._16_4_ = auVar86._16_4_ * fVar209;
    auVar36._20_4_ = auVar86._20_4_ * fVar209;
    auVar36._24_4_ = auVar86._24_4_ * fVar209;
    auVar36._28_4_ = auVar86._28_4_;
    auVar37._4_4_ = auVar100._4_4_ * fVar209;
    auVar37._0_4_ = auVar100._0_4_ * fVar209;
    auVar37._8_4_ = auVar100._8_4_ * fVar209;
    auVar37._12_4_ = auVar100._12_4_ * fVar209;
    auVar37._16_4_ = auVar100._16_4_ * fVar209;
    auVar37._20_4_ = auVar100._20_4_ * fVar209;
    auVar37._24_4_ = auVar100._24_4_ * fVar209;
    auVar37._28_4_ = auVar100._28_4_;
    fVar234 = auVar103._0_4_ * fVar209;
    fVar237 = auVar103._4_4_ * fVar209;
    auVar38._4_4_ = fVar237;
    auVar38._0_4_ = fVar234;
    fVar238 = auVar103._8_4_ * fVar209;
    auVar38._8_4_ = fVar238;
    fVar239 = auVar103._12_4_ * fVar209;
    auVar38._12_4_ = fVar239;
    fVar240 = auVar103._16_4_ * fVar209;
    auVar38._16_4_ = fVar240;
    fVar241 = auVar103._20_4_ * fVar209;
    auVar38._20_4_ = fVar241;
    fVar209 = auVar103._24_4_ * fVar209;
    auVar38._24_4_ = fVar209;
    auVar38._28_4_ = fStack_224;
    auVar76 = vxorps_avx512vl(auVar98._0_16_,auVar98._0_16_);
    auVar103 = vpermt2ps_avx512vl(auVar104,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar249 = ZEXT3264(auVar103);
    auVar108 = vpermt2ps_avx512vl(local_5e0,_DAT_0205fd20,ZEXT1632(auVar76));
    auVar86 = ZEXT1632(auVar76);
    auVar105 = vpermt2ps_avx512vl(auVar101,_DAT_0205fd20,auVar86);
    auVar231._0_4_ = auVar102._0_4_ + fVar234;
    auVar231._4_4_ = auVar102._4_4_ + fVar237;
    auVar231._8_4_ = auVar102._8_4_ + fVar238;
    auVar231._12_4_ = auVar102._12_4_ + fVar239;
    auVar231._16_4_ = auVar102._16_4_ + fVar240;
    auVar231._20_4_ = auVar102._20_4_ + fVar241;
    auVar231._24_4_ = auVar102._24_4_ + fVar209;
    auVar231._28_4_ = auVar102._28_4_ + fStack_224;
    auVar99 = vmaxps_avx(auVar102,auVar231);
    auVar85 = vminps_avx(auVar102,auVar231);
    auVar102 = vpermt2ps_avx512vl(auVar102,_DAT_0205fd20,auVar86);
    auVar107 = vpermt2ps_avx512vl(auVar133,_DAT_0205fd20,auVar86);
    auVar109 = vpermt2ps_avx512vl(auVar36,_DAT_0205fd20,auVar86);
    auVar123 = ZEXT1632(auVar76);
    auVar110 = vpermt2ps_avx512vl(auVar37,_DAT_0205fd20,auVar123);
    auVar86 = vpermt2ps_avx512vl(auVar38,_DAT_0205fd20,auVar123);
    auVar111 = vsubps_avx512vl(auVar102,auVar86);
    auVar86 = vsubps_avx(auVar103,auVar104);
    auVar100 = vsubps_avx(auVar108,local_5e0);
    auVar236 = ZEXT3264(auVar100);
    auVar112 = vsubps_avx512vl(auVar105,auVar101);
    auVar113 = vmulps_avx512vl(auVar100,auVar37);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar36,auVar112);
    auVar114 = vmulps_avx512vl(auVar112,auVar133);
    auVar114 = vfmsub231ps_avx512vl(auVar114,auVar37,auVar86);
    auVar115 = vmulps_avx512vl(auVar86,auVar36);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar133,auVar100);
    auVar115 = vmulps_avx512vl(auVar115,auVar115);
    auVar114 = vfmadd231ps_avx512vl(auVar115,auVar114,auVar114);
    auVar113 = vfmadd231ps_avx512vl(auVar114,auVar113,auVar113);
    auVar114 = vmulps_avx512vl(auVar112,auVar112);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar100,auVar100);
    auVar114 = vfmadd231ps_avx512vl(auVar114,auVar86,auVar86);
    auVar115 = vrcp14ps_avx512vl(auVar114);
    auVar116 = vfnmadd213ps_avx512vl(auVar115,auVar114,auVar106);
    auVar115 = vfmadd132ps_avx512vl(auVar116,auVar115,auVar115);
    auVar113 = vmulps_avx512vl(auVar113,auVar115);
    auVar116 = vmulps_avx512vl(auVar100,auVar110);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar109,auVar112);
    auVar117 = vmulps_avx512vl(auVar112,auVar107);
    auVar117 = vfmsub231ps_avx512vl(auVar117,auVar110,auVar86);
    auVar118 = vmulps_avx512vl(auVar86,auVar109);
    auVar118 = vfmsub231ps_avx512vl(auVar118,auVar107,auVar100);
    auVar118 = vmulps_avx512vl(auVar118,auVar118);
    auVar117 = vfmadd231ps_avx512vl(auVar118,auVar117,auVar117);
    auVar116 = vfmadd231ps_avx512vl(auVar117,auVar116,auVar116);
    auVar115 = vmulps_avx512vl(auVar116,auVar115);
    auVar113 = vmaxps_avx512vl(auVar113,auVar115);
    auVar113 = vsqrtps_avx512vl(auVar113);
    auVar115 = vmaxps_avx512vl(auVar111,auVar102);
    auVar99 = vmaxps_avx512vl(auVar99,auVar115);
    auVar115 = vaddps_avx512vl(auVar113,auVar99);
    auVar99 = vminps_avx512vl(auVar111,auVar102);
    auVar99 = vminps_avx(auVar85,auVar99);
    auVar99 = vsubps_avx512vl(auVar99,auVar113);
    auVar116._8_4_ = 0x3f800002;
    auVar116._0_8_ = 0x3f8000023f800002;
    auVar116._12_4_ = 0x3f800002;
    auVar116._16_4_ = 0x3f800002;
    auVar116._20_4_ = 0x3f800002;
    auVar116._24_4_ = 0x3f800002;
    auVar116._28_4_ = 0x3f800002;
    auVar85 = vmulps_avx512vl(auVar115,auVar116);
    auVar117._8_4_ = 0x3f7ffffc;
    auVar117._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar117._12_4_ = 0x3f7ffffc;
    auVar117._16_4_ = 0x3f7ffffc;
    auVar117._20_4_ = 0x3f7ffffc;
    auVar117._24_4_ = 0x3f7ffffc;
    auVar117._28_4_ = 0x3f7ffffc;
    auVar99 = vmulps_avx512vl(auVar99,auVar117);
    auVar39._4_4_ = auVar85._4_4_ * auVar85._4_4_;
    auVar39._0_4_ = auVar85._0_4_ * auVar85._0_4_;
    auVar39._8_4_ = auVar85._8_4_ * auVar85._8_4_;
    auVar39._12_4_ = auVar85._12_4_ * auVar85._12_4_;
    auVar39._16_4_ = auVar85._16_4_ * auVar85._16_4_;
    auVar39._20_4_ = auVar85._20_4_ * auVar85._20_4_;
    auVar39._24_4_ = auVar85._24_4_ * auVar85._24_4_;
    auVar39._28_4_ = auVar99._28_4_;
    auVar85 = vrsqrt14ps_avx512vl(auVar114);
    auVar118._8_4_ = 0xbf000000;
    auVar118._0_8_ = 0xbf000000bf000000;
    auVar118._12_4_ = 0xbf000000;
    auVar118._16_4_ = 0xbf000000;
    auVar118._20_4_ = 0xbf000000;
    auVar118._24_4_ = 0xbf000000;
    auVar118._28_4_ = 0xbf000000;
    auVar102 = vmulps_avx512vl(auVar114,auVar118);
    auVar40._4_4_ = auVar85._4_4_ * auVar102._4_4_;
    auVar40._0_4_ = auVar85._0_4_ * auVar102._0_4_;
    auVar40._8_4_ = auVar85._8_4_ * auVar102._8_4_;
    auVar40._12_4_ = auVar85._12_4_ * auVar102._12_4_;
    auVar40._16_4_ = auVar85._16_4_ * auVar102._16_4_;
    auVar40._20_4_ = auVar85._20_4_ * auVar102._20_4_;
    auVar40._24_4_ = auVar85._24_4_ * auVar102._24_4_;
    auVar40._28_4_ = auVar102._28_4_;
    auVar102 = vmulps_avx512vl(auVar85,auVar85);
    auVar102 = vmulps_avx512vl(auVar102,auVar40);
    auVar119._8_4_ = 0x3fc00000;
    auVar119._0_8_ = 0x3fc000003fc00000;
    auVar119._12_4_ = 0x3fc00000;
    auVar119._16_4_ = 0x3fc00000;
    auVar119._20_4_ = 0x3fc00000;
    auVar119._24_4_ = 0x3fc00000;
    auVar119._28_4_ = 0x3fc00000;
    auVar102 = vfmadd231ps_avx512vl(auVar102,auVar85,auVar119);
    auVar41._4_4_ = auVar102._4_4_ * auVar86._4_4_;
    auVar41._0_4_ = auVar102._0_4_ * auVar86._0_4_;
    auVar41._8_4_ = auVar102._8_4_ * auVar86._8_4_;
    auVar41._12_4_ = auVar102._12_4_ * auVar86._12_4_;
    auVar41._16_4_ = auVar102._16_4_ * auVar86._16_4_;
    auVar41._20_4_ = auVar102._20_4_ * auVar86._20_4_;
    auVar41._24_4_ = auVar102._24_4_ * auVar86._24_4_;
    auVar41._28_4_ = auVar85._28_4_;
    auVar85 = vmulps_avx512vl(auVar100,auVar102);
    auVar111 = vmulps_avx512vl(auVar112,auVar102);
    auVar113 = vsubps_avx512vl(auVar123,auVar104);
    auVar114 = vsubps_avx512vl(auVar123,local_5e0);
    auVar115 = vsubps_avx512vl(auVar123,auVar101);
    auVar116 = vmulps_avx512vl(local_480,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar89,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,auVar88,auVar113);
    auVar117 = vmulps_avx512vl(auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(local_480,auVar111);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar85,auVar89);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar41,auVar88);
    auVar111 = vmulps_avx512vl(auVar115,auVar111);
    auVar85 = vfmadd231ps_avx512vl(auVar111,auVar114,auVar85);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar113,auVar41);
    local_600 = vmulps_avx512vl(auVar118,auVar118);
    auVar111 = vsubps_avx512vl(local_260,local_600);
    auVar119 = vmulps_avx512vl(auVar118,auVar85);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar85,auVar85);
    auVar117 = vsubps_avx512vl(auVar117,auVar119);
    auVar119 = vsubps_avx512vl(auVar117,auVar39);
    auVar120 = vmulps_avx512vl(auVar116,auVar116);
    auVar121._8_4_ = 0x40800000;
    auVar121._0_8_ = 0x4080000040800000;
    auVar121._12_4_ = 0x40800000;
    auVar121._16_4_ = 0x40800000;
    auVar121._20_4_ = 0x40800000;
    auVar121._24_4_ = 0x40800000;
    auVar121._28_4_ = 0x40800000;
    auVar121 = vmulps_avx512vl(auVar111,auVar121);
    auVar122 = vmulps_avx512vl(auVar121,auVar119);
    auVar122 = vsubps_avx512vl(auVar120,auVar122);
    uVar72 = vcmpps_avx512vl(auVar122,auVar123,5);
    bVar59 = (byte)uVar72;
    if (bVar59 == 0) {
      auVar125 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar126 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
    }
    else {
      auVar122 = vsqrtps_avx512vl(auVar122);
      auVar123 = vaddps_avx512vl(auVar111,auVar111);
      auVar124 = vrcp14ps_avx512vl(auVar123);
      auVar123 = vfnmadd213ps_avx512vl(auVar123,auVar124,auVar106);
      auVar123 = vfmadd132ps_avx512vl(auVar123,auVar124,auVar124);
      auVar24._8_4_ = 0x80000000;
      auVar24._0_8_ = 0x8000000080000000;
      auVar24._12_4_ = 0x80000000;
      auVar24._16_4_ = 0x80000000;
      auVar24._20_4_ = 0x80000000;
      auVar24._24_4_ = 0x80000000;
      auVar24._28_4_ = 0x80000000;
      auVar124 = vxorps_avx512vl(auVar116,auVar24);
      auVar124 = vsubps_avx512vl(auVar124,auVar122);
      auVar124 = vmulps_avx512vl(auVar124,auVar123);
      auVar122 = vsubps_avx512vl(auVar122,auVar116);
      auVar122 = vmulps_avx512vl(auVar122,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar124,auVar85);
      local_540 = vmulps_avx512vl(auVar102,auVar123);
      auVar123 = vfmadd213ps_avx512vl(auVar118,auVar122,auVar85);
      local_560 = vmulps_avx512vl(auVar102,auVar123);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar123 = vblendmps_avx512vl(auVar123,auVar124);
      auVar125._0_4_ =
           (uint)(bVar59 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar59 & 1) * local_560._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar125._4_4_ = (uint)bVar71 * auVar123._4_4_ | (uint)!bVar71 * local_560._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar125._8_4_ = (uint)bVar71 * auVar123._8_4_ | (uint)!bVar71 * local_560._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar125._12_4_ = (uint)bVar71 * auVar123._12_4_ | (uint)!bVar71 * local_560._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar125._16_4_ = (uint)bVar71 * auVar123._16_4_ | (uint)!bVar71 * local_560._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar125._20_4_ = (uint)bVar71 * auVar123._20_4_ | (uint)!bVar71 * local_560._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar125._24_4_ = (uint)bVar71 * auVar123._24_4_ | (uint)!bVar71 * local_560._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar125._28_4_ = (uint)bVar71 * auVar123._28_4_ | (uint)!bVar71 * local_560._28_4_;
      auVar217._8_4_ = 0xff800000;
      auVar217._0_8_ = 0xff800000ff800000;
      auVar217._12_4_ = 0xff800000;
      auVar217._16_4_ = 0xff800000;
      auVar217._20_4_ = 0xff800000;
      auVar217._24_4_ = 0xff800000;
      auVar217._28_4_ = 0xff800000;
      auVar123 = vblendmps_avx512vl(auVar217,auVar122);
      auVar126._0_4_ =
           (uint)(bVar59 & 1) * auVar123._0_4_ | (uint)!(bool)(bVar59 & 1) * auVar122._0_4_;
      bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
      auVar126._4_4_ = (uint)bVar71 * auVar123._4_4_ | (uint)!bVar71 * auVar122._4_4_;
      bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
      auVar126._8_4_ = (uint)bVar71 * auVar123._8_4_ | (uint)!bVar71 * auVar122._8_4_;
      bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
      auVar126._12_4_ = (uint)bVar71 * auVar123._12_4_ | (uint)!bVar71 * auVar122._12_4_;
      bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
      auVar126._16_4_ = (uint)bVar71 * auVar123._16_4_ | (uint)!bVar71 * auVar122._16_4_;
      bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
      auVar126._20_4_ = (uint)bVar71 * auVar123._20_4_ | (uint)!bVar71 * auVar122._20_4_;
      bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
      auVar126._24_4_ = (uint)bVar71 * auVar123._24_4_ | (uint)!bVar71 * auVar122._24_4_;
      bVar71 = SUB81(uVar72 >> 7,0);
      auVar126._28_4_ = (uint)bVar71 * auVar123._28_4_ | (uint)!bVar71 * auVar122._28_4_;
      auVar122 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(local_600,auVar122);
      auVar123 = vmaxps_avx512vl(local_4a0,auVar122);
      auVar25._8_4_ = 0x36000000;
      auVar25._0_8_ = 0x3600000036000000;
      auVar25._12_4_ = 0x36000000;
      auVar25._16_4_ = 0x36000000;
      auVar25._20_4_ = 0x36000000;
      auVar25._24_4_ = 0x36000000;
      auVar25._28_4_ = 0x36000000;
      auVar123 = vmulps_avx512vl(auVar123,auVar25);
      vandps_avx512vl(auVar111,auVar122);
      uVar65 = vcmpps_avx512vl(auVar123,auVar123,1);
      uVar72 = uVar72 & uVar65;
      bVar67 = (byte)uVar72;
      if (bVar67 != 0) {
        uVar65 = vcmpps_avx512vl(auVar119,_DAT_02020f00,2);
        auVar233._8_4_ = 0xff800000;
        auVar233._0_8_ = 0xff800000ff800000;
        auVar233._12_4_ = 0xff800000;
        auVar233._16_4_ = 0xff800000;
        auVar233._20_4_ = 0xff800000;
        auVar233._24_4_ = 0xff800000;
        auVar233._28_4_ = 0xff800000;
        auVar119 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar122 = vblendmps_avx512vl(auVar119,auVar233);
        bVar61 = (byte)uVar65;
        uVar73 = (uint)(bVar61 & 1) * auVar122._0_4_ | (uint)!(bool)(bVar61 & 1) * auVar123._0_4_;
        bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
        uVar144 = (uint)bVar71 * auVar122._4_4_ | (uint)!bVar71 * auVar123._4_4_;
        bVar71 = (bool)((byte)(uVar65 >> 2) & 1);
        uVar145 = (uint)bVar71 * auVar122._8_4_ | (uint)!bVar71 * auVar123._8_4_;
        bVar71 = (bool)((byte)(uVar65 >> 3) & 1);
        uVar146 = (uint)bVar71 * auVar122._12_4_ | (uint)!bVar71 * auVar123._12_4_;
        bVar71 = (bool)((byte)(uVar65 >> 4) & 1);
        uVar147 = (uint)bVar71 * auVar122._16_4_ | (uint)!bVar71 * auVar123._16_4_;
        bVar71 = (bool)((byte)(uVar65 >> 5) & 1);
        uVar148 = (uint)bVar71 * auVar122._20_4_ | (uint)!bVar71 * auVar123._20_4_;
        bVar71 = (bool)((byte)(uVar65 >> 6) & 1);
        uVar149 = (uint)bVar71 * auVar122._24_4_ | (uint)!bVar71 * auVar123._24_4_;
        bVar71 = SUB81(uVar65 >> 7,0);
        uVar150 = (uint)bVar71 * auVar122._28_4_ | (uint)!bVar71 * auVar123._28_4_;
        auVar125._0_4_ = (bVar67 & 1) * uVar73 | !(bool)(bVar67 & 1) * auVar125._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar125._4_4_ = bVar71 * uVar144 | !bVar71 * auVar125._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar125._8_4_ = bVar71 * uVar145 | !bVar71 * auVar125._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar125._12_4_ = bVar71 * uVar146 | !bVar71 * auVar125._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar125._16_4_ = bVar71 * uVar147 | !bVar71 * auVar125._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar125._20_4_ = bVar71 * uVar148 | !bVar71 * auVar125._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar125._24_4_ = bVar71 * uVar149 | !bVar71 * auVar125._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar125._28_4_ = bVar71 * uVar150 | !bVar71 * auVar125._28_4_;
        auVar119 = vblendmps_avx512vl(auVar233,auVar119);
        bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar65 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar65 >> 6) & 1);
        bVar14 = SUB81(uVar65 >> 7,0);
        auVar126._0_4_ =
             (uint)(bVar67 & 1) *
             ((uint)(bVar61 & 1) * auVar119._0_4_ | !(bool)(bVar61 & 1) * uVar73) |
             !(bool)(bVar67 & 1) * auVar126._0_4_;
        bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar126._4_4_ =
             (uint)bVar8 * ((uint)bVar71 * auVar119._4_4_ | !bVar71 * uVar144) |
             !bVar8 * auVar126._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar126._8_4_ =
             (uint)bVar71 * ((uint)bVar9 * auVar119._8_4_ | !bVar9 * uVar145) |
             !bVar71 * auVar126._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar126._12_4_ =
             (uint)bVar71 * ((uint)bVar10 * auVar119._12_4_ | !bVar10 * uVar146) |
             !bVar71 * auVar126._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar126._16_4_ =
             (uint)bVar71 * ((uint)bVar11 * auVar119._16_4_ | !bVar11 * uVar147) |
             !bVar71 * auVar126._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar126._20_4_ =
             (uint)bVar71 * ((uint)bVar12 * auVar119._20_4_ | !bVar12 * uVar148) |
             !bVar71 * auVar126._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar126._24_4_ =
             (uint)bVar71 * ((uint)bVar13 * auVar119._24_4_ | !bVar13 * uVar149) |
             !bVar71 * auVar126._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar126._28_4_ =
             (uint)bVar71 * ((uint)bVar14 * auVar119._28_4_ | !bVar14 * uVar150) |
             !bVar71 * auVar126._28_4_;
        bVar59 = (~bVar67 | bVar61) & bVar59;
      }
      auVar106._8_4_ = 0x3f800000;
      auVar106._0_8_ = &DAT_3f8000003f800000;
      auVar106._12_4_ = 0x3f800000;
      auVar106._16_4_ = 0x3f800000;
      auVar106._20_4_ = 0x3f800000;
      auVar106._24_4_ = 0x3f800000;
      auVar106._28_4_ = 0x3f800000;
    }
    if ((bVar59 & 0x7f) == 0) {
      auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar263 = ZEXT3264(auVar99);
LAB_01f13134:
      auVar259 = ZEXT3264(auVar133);
      auVar253 = ZEXT3264(auVar108);
      auVar223 = ZEXT3264(auVar106);
    }
    else {
      fVar234 = *(float *)(ray + k * 4 + 0x100) - (float)local_690._0_4_;
      auVar218._4_4_ = fVar234;
      auVar218._0_4_ = fVar234;
      auVar218._8_4_ = fVar234;
      auVar218._12_4_ = fVar234;
      auVar218._16_4_ = fVar234;
      auVar218._20_4_ = fVar234;
      auVar218._24_4_ = fVar234;
      auVar218._28_4_ = fVar234;
      auVar119 = vminps_avx512vl(auVar218,auVar126);
      auVar58._4_4_ = fStack_27c;
      auVar58._0_4_ = local_280;
      auVar58._8_4_ = fStack_278;
      auVar58._12_4_ = fStack_274;
      auVar58._16_4_ = fStack_270;
      auVar58._20_4_ = fStack_26c;
      auVar58._24_4_ = fStack_268;
      auVar58._28_4_ = fStack_264;
      auVar122 = vmaxps_avx512vl(auVar58,auVar125);
      auVar115 = vmulps_avx512vl(auVar115,auVar37);
      auVar114 = vfmadd213ps_avx512vl(auVar114,auVar36,auVar115);
      auVar113 = vfmadd213ps_avx512vl(auVar113,auVar133,auVar114);
      auVar114 = vmulps_avx512vl(local_480,auVar37);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar89,auVar36);
      auVar114 = vfmadd231ps_avx512vl(auVar114,auVar88,auVar133);
      auVar115 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      auVar263 = ZEXT3264(auVar115);
      vandps_avx512vl(auVar114,auVar115);
      auVar123 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
      uVar16 = vcmpps_avx512vl(auVar115,auVar123,1);
      auVar124 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
      auVar113 = vxorps_avx512vl(auVar113,auVar124);
      auVar127 = vrcp14ps_avx512vl(auVar114);
      auVar128 = vxorps_avx512vl(auVar114,auVar124);
      auVar129 = vfnmadd213ps_avx512vl(auVar127,auVar114,auVar106);
      auVar129 = vfmadd132ps_avx512vl(auVar129,auVar127,auVar127);
      auVar129 = vmulps_avx512vl(auVar129,auVar113);
      uVar18 = vcmpps_avx512vl(auVar114,auVar128,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar130 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar113 = vblendmps_avx512vl(auVar129,auVar130);
      auVar131._0_4_ =
           (uint)(bVar67 & 1) * auVar113._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar127._0_4_;
      bVar71 = (bool)(bVar67 >> 1 & 1);
      auVar131._4_4_ = (uint)bVar71 * auVar113._4_4_ | (uint)!bVar71 * auVar127._4_4_;
      bVar71 = (bool)(bVar67 >> 2 & 1);
      auVar131._8_4_ = (uint)bVar71 * auVar113._8_4_ | (uint)!bVar71 * auVar127._8_4_;
      bVar71 = (bool)(bVar67 >> 3 & 1);
      auVar131._12_4_ = (uint)bVar71 * auVar113._12_4_ | (uint)!bVar71 * auVar127._12_4_;
      bVar71 = (bool)(bVar67 >> 4 & 1);
      auVar131._16_4_ = (uint)bVar71 * auVar113._16_4_ | (uint)!bVar71 * auVar127._16_4_;
      bVar71 = (bool)(bVar67 >> 5 & 1);
      auVar131._20_4_ = (uint)bVar71 * auVar113._20_4_ | (uint)!bVar71 * auVar127._20_4_;
      bVar71 = (bool)(bVar67 >> 6 & 1);
      auVar131._24_4_ = (uint)bVar71 * auVar113._24_4_ | (uint)!bVar71 * auVar127._24_4_;
      auVar131._28_4_ =
           (uint)(bVar67 >> 7) * auVar113._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar127._28_4_;
      auVar113 = vmaxps_avx(auVar122,auVar131);
      uVar18 = vcmpps_avx512vl(auVar114,auVar128,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar132._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * auVar129._0_4_;
      bVar71 = (bool)(bVar67 >> 1 & 1);
      auVar132._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._4_4_;
      bVar71 = (bool)(bVar67 >> 2 & 1);
      auVar132._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._8_4_;
      bVar71 = (bool)(bVar67 >> 3 & 1);
      auVar132._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._12_4_;
      bVar71 = (bool)(bVar67 >> 4 & 1);
      auVar132._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._16_4_;
      bVar71 = (bool)(bVar67 >> 5 & 1);
      auVar132._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._20_4_;
      bVar71 = (bool)(bVar67 >> 6 & 1);
      auVar132._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * auVar129._24_4_;
      auVar132._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar129._28_4_;
      auVar114 = vminps_avx(auVar119,auVar132);
      auVar76 = vxorps_avx512vl(auVar128._0_16_,auVar128._0_16_);
      auVar103 = vsubps_avx512vl(ZEXT1632(auVar76),auVar103);
      auVar119 = vsubps_avx512vl(ZEXT1632(auVar76),auVar108);
      auVar122 = ZEXT1632(auVar76);
      auVar105 = vsubps_avx512vl(auVar122,auVar105);
      auVar42._4_4_ = auVar105._4_4_ * auVar110._4_4_;
      auVar42._0_4_ = auVar105._0_4_ * auVar110._0_4_;
      auVar42._8_4_ = auVar105._8_4_ * auVar110._8_4_;
      auVar42._12_4_ = auVar105._12_4_ * auVar110._12_4_;
      auVar42._16_4_ = auVar105._16_4_ * auVar110._16_4_;
      auVar42._20_4_ = auVar105._20_4_ * auVar110._20_4_;
      auVar42._24_4_ = auVar105._24_4_ * auVar110._24_4_;
      auVar42._28_4_ = auVar105._28_4_;
      auVar105 = vfnmsub231ps_avx512vl(auVar42,auVar109,auVar119);
      auVar103 = vfnmadd231ps_avx512vl(auVar105,auVar107,auVar103);
      auVar105 = vmulps_avx512vl(local_480,auVar110);
      auVar105 = vfnmsub231ps_avx512vl(auVar105,auVar89,auVar109);
      auVar105 = vfnmadd231ps_avx512vl(auVar105,auVar88,auVar107);
      vandps_avx512vl(auVar105,auVar115);
      uVar16 = vcmpps_avx512vl(auVar105,auVar123,1);
      auVar103 = vxorps_avx512vl(auVar103,auVar124);
      auVar107 = vrcp14ps_avx512vl(auVar105);
      auVar133 = vxorps_avx512vl(auVar105,auVar124);
      auVar110 = vfnmadd213ps_avx512vl(auVar107,auVar105,auVar106);
      auVar76 = vfmadd132ps_fma(auVar110,auVar107,auVar107);
      fVar234 = auVar76._0_4_ * auVar103._0_4_;
      fVar237 = auVar76._4_4_ * auVar103._4_4_;
      auVar43._4_4_ = fVar237;
      auVar43._0_4_ = fVar234;
      fVar238 = auVar76._8_4_ * auVar103._8_4_;
      auVar43._8_4_ = fVar238;
      fVar239 = auVar76._12_4_ * auVar103._12_4_;
      auVar43._12_4_ = fVar239;
      fVar240 = auVar103._16_4_ * 0.0;
      auVar43._16_4_ = fVar240;
      fVar241 = auVar103._20_4_ * 0.0;
      auVar43._20_4_ = fVar241;
      fVar257 = auVar103._24_4_ * 0.0;
      auVar43._24_4_ = fVar257;
      auVar43._28_4_ = auVar103._28_4_;
      uVar18 = vcmpps_avx512vl(auVar105,auVar133,1);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar110 = vblendmps_avx512vl(auVar43,auVar130);
      auVar134._0_4_ =
           (uint)(bVar67 & 1) * auVar110._0_4_ | (uint)!(bool)(bVar67 & 1) * auVar107._0_4_;
      bVar71 = (bool)(bVar67 >> 1 & 1);
      auVar134._4_4_ = (uint)bVar71 * auVar110._4_4_ | (uint)!bVar71 * auVar107._4_4_;
      bVar71 = (bool)(bVar67 >> 2 & 1);
      auVar134._8_4_ = (uint)bVar71 * auVar110._8_4_ | (uint)!bVar71 * auVar107._8_4_;
      bVar71 = (bool)(bVar67 >> 3 & 1);
      auVar134._12_4_ = (uint)bVar71 * auVar110._12_4_ | (uint)!bVar71 * auVar107._12_4_;
      bVar71 = (bool)(bVar67 >> 4 & 1);
      auVar134._16_4_ = (uint)bVar71 * auVar110._16_4_ | (uint)!bVar71 * auVar107._16_4_;
      bVar71 = (bool)(bVar67 >> 5 & 1);
      auVar134._20_4_ = (uint)bVar71 * auVar110._20_4_ | (uint)!bVar71 * auVar107._20_4_;
      bVar71 = (bool)(bVar67 >> 6 & 1);
      auVar134._24_4_ = (uint)bVar71 * auVar110._24_4_ | (uint)!bVar71 * auVar107._24_4_;
      auVar134._28_4_ =
           (uint)(bVar67 >> 7) * auVar110._28_4_ | (uint)!(bool)(bVar67 >> 7) * auVar107._28_4_;
      _local_620 = vmaxps_avx(auVar113,auVar134);
      uVar18 = vcmpps_avx512vl(auVar105,auVar133,6);
      bVar67 = (byte)uVar16 | (byte)uVar18;
      auVar108._0_4_ = (uint)(bVar67 & 1) * 0x7f800000 | (uint)!(bool)(bVar67 & 1) * (int)fVar234;
      bVar71 = (bool)(bVar67 >> 1 & 1);
      auVar108._4_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar237;
      bVar71 = (bool)(bVar67 >> 2 & 1);
      auVar108._8_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar238;
      bVar71 = (bool)(bVar67 >> 3 & 1);
      auVar108._12_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar239;
      bVar71 = (bool)(bVar67 >> 4 & 1);
      auVar108._16_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar240;
      bVar71 = (bool)(bVar67 >> 5 & 1);
      auVar108._20_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar241;
      bVar71 = (bool)(bVar67 >> 6 & 1);
      auVar108._24_4_ = (uint)bVar71 * 0x7f800000 | (uint)!bVar71 * (int)fVar257;
      auVar108._28_4_ =
           (uint)(bVar67 >> 7) * 0x7f800000 | (uint)!(bool)(bVar67 >> 7) * auVar103._28_4_;
      local_320 = vminps_avx(auVar114,auVar108);
      auVar249 = ZEXT3264(local_320);
      uVar16 = vcmpps_avx512vl(_local_620,local_320,2);
      bVar59 = bVar59 & 0x7f & (byte)uVar16;
      if (bVar59 == 0) goto LAB_01f13134;
      auVar103 = vmaxps_avx512vl(auVar122,auVar99);
      auVar99 = vminps_avx512vl(local_540,auVar106);
      auVar49 = ZEXT412(0);
      auVar105 = ZEXT1232(auVar49) << 0x20;
      auVar99 = vmaxps_avx(auVar99,ZEXT1232(auVar49) << 0x20);
      auVar107 = vminps_avx512vl(local_560,auVar106);
      auVar44._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar44._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar44._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar44._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar44._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar44._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar44._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar44._28_4_ = auVar99._28_4_ + 7.0;
      auVar76 = vfmadd213ps_fma(auVar44,auVar163,auVar229);
      local_540 = ZEXT1632(auVar76);
      auVar99 = vmaxps_avx(auVar107,ZEXT1232(auVar49) << 0x20);
      auVar45._4_4_ = (auVar99._4_4_ + 1.0) * 0.125;
      auVar45._0_4_ = (auVar99._0_4_ + 0.0) * 0.125;
      auVar45._8_4_ = (auVar99._8_4_ + 2.0) * 0.125;
      auVar45._12_4_ = (auVar99._12_4_ + 3.0) * 0.125;
      auVar45._16_4_ = (auVar99._16_4_ + 4.0) * 0.125;
      auVar45._20_4_ = (auVar99._20_4_ + 5.0) * 0.125;
      auVar45._24_4_ = (auVar99._24_4_ + 6.0) * 0.125;
      auVar45._28_4_ = auVar99._28_4_ + 7.0;
      auVar76 = vfmadd213ps_fma(auVar45,auVar163,auVar229);
      local_560 = ZEXT1632(auVar76);
      auVar219._0_4_ = auVar103._0_4_ * auVar103._0_4_;
      auVar219._4_4_ = auVar103._4_4_ * auVar103._4_4_;
      auVar219._8_4_ = auVar103._8_4_ * auVar103._8_4_;
      auVar219._12_4_ = auVar103._12_4_ * auVar103._12_4_;
      auVar219._16_4_ = auVar103._16_4_ * auVar103._16_4_;
      auVar219._20_4_ = auVar103._20_4_ * auVar103._20_4_;
      auVar219._24_4_ = auVar103._24_4_ * auVar103._24_4_;
      auVar219._28_4_ = 0;
      auVar99 = vsubps_avx(auVar117,auVar219);
      auVar259 = ZEXT3264(auVar99);
      auVar103 = vmulps_avx512vl(auVar121,auVar99);
      auVar103 = vsubps_avx(auVar120,auVar103);
      uVar16 = vcmpps_avx512vl(auVar103,ZEXT1232(auVar49) << 0x20,5);
      bVar67 = (byte)uVar16;
      if (bVar67 == 0) {
        auVar85 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar86 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar103 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar107 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar253 = ZEXT864(0) << 0x20;
        auVar135._8_4_ = 0x7f800000;
        auVar135._0_8_ = 0x7f8000007f800000;
        auVar135._12_4_ = 0x7f800000;
        auVar135._16_4_ = 0x7f800000;
        auVar135._20_4_ = 0x7f800000;
        auVar135._24_4_ = 0x7f800000;
        auVar135._28_4_ = 0x7f800000;
        auVar136._8_4_ = 0xff800000;
        auVar136._0_8_ = 0xff800000ff800000;
        auVar136._12_4_ = 0xff800000;
        auVar136._16_4_ = 0xff800000;
        auVar136._20_4_ = 0xff800000;
        auVar136._24_4_ = 0xff800000;
        auVar136._28_4_ = 0xff800000;
      }
      else {
        auVar77 = vxorps_avx512vl(auVar109._0_16_,auVar109._0_16_);
        uVar72 = vcmpps_avx512vl(auVar103,auVar122,5);
        auVar103 = vsqrtps_avx(auVar103);
        auVar232._0_4_ = auVar111._0_4_ + auVar111._0_4_;
        auVar232._4_4_ = auVar111._4_4_ + auVar111._4_4_;
        auVar232._8_4_ = auVar111._8_4_ + auVar111._8_4_;
        auVar232._12_4_ = auVar111._12_4_ + auVar111._12_4_;
        auVar232._16_4_ = auVar111._16_4_ + auVar111._16_4_;
        auVar232._20_4_ = auVar111._20_4_ + auVar111._20_4_;
        auVar232._24_4_ = auVar111._24_4_ + auVar111._24_4_;
        auVar232._28_4_ = auVar111._28_4_ + auVar111._28_4_;
        auVar105 = vrcp14ps_avx512vl(auVar232);
        auVar107 = vfnmadd213ps_avx512vl(auVar232,auVar105,auVar106);
        auVar76 = vfmadd132ps_fma(auVar107,auVar105,auVar105);
        auVar26._8_4_ = 0x80000000;
        auVar26._0_8_ = 0x8000000080000000;
        auVar26._12_4_ = 0x80000000;
        auVar26._16_4_ = 0x80000000;
        auVar26._20_4_ = 0x80000000;
        auVar26._24_4_ = 0x80000000;
        auVar26._28_4_ = 0x80000000;
        auVar105 = vxorps_avx512vl(auVar116,auVar26);
        auVar105 = vsubps_avx(auVar105,auVar103);
        auVar46._4_4_ = auVar105._4_4_ * auVar76._4_4_;
        auVar46._0_4_ = auVar105._0_4_ * auVar76._0_4_;
        auVar46._8_4_ = auVar105._8_4_ * auVar76._8_4_;
        auVar46._12_4_ = auVar105._12_4_ * auVar76._12_4_;
        auVar46._16_4_ = auVar105._16_4_ * 0.0;
        auVar46._20_4_ = auVar105._20_4_ * 0.0;
        auVar46._24_4_ = auVar105._24_4_ * 0.0;
        auVar46._28_4_ = 0x3e000000;
        auVar103 = vsubps_avx512vl(auVar103,auVar116);
        auVar47._4_4_ = auVar103._4_4_ * auVar76._4_4_;
        auVar47._0_4_ = auVar103._0_4_ * auVar76._0_4_;
        auVar47._8_4_ = auVar103._8_4_ * auVar76._8_4_;
        auVar47._12_4_ = auVar103._12_4_ * auVar76._12_4_;
        auVar47._16_4_ = auVar103._16_4_ * 0.0;
        auVar47._20_4_ = auVar103._20_4_ * 0.0;
        auVar47._24_4_ = auVar103._24_4_ * 0.0;
        auVar47._28_4_ = fVar251;
        auVar103 = vfmadd213ps_avx512vl(auVar118,auVar46,auVar85);
        auVar48._4_4_ = auVar102._4_4_ * auVar103._4_4_;
        auVar48._0_4_ = auVar102._0_4_ * auVar103._0_4_;
        auVar48._8_4_ = auVar102._8_4_ * auVar103._8_4_;
        auVar48._12_4_ = auVar102._12_4_ * auVar103._12_4_;
        auVar48._16_4_ = auVar102._16_4_ * auVar103._16_4_;
        auVar48._20_4_ = auVar102._20_4_ * auVar103._20_4_;
        auVar48._24_4_ = auVar102._24_4_ * auVar103._24_4_;
        auVar48._28_4_ = auVar105._28_4_;
        auVar103 = vmulps_avx512vl(auVar88,auVar46);
        auVar105 = vmulps_avx512vl(auVar89,auVar46);
        auVar109 = vmulps_avx512vl(local_480,auVar46);
        auVar107 = vfmadd213ps_avx512vl(auVar86,auVar48,auVar104);
        auVar103 = vsubps_avx512vl(auVar103,auVar107);
        auVar107 = vfmadd213ps_avx512vl(auVar100,auVar48,local_5e0);
        auVar107 = vsubps_avx512vl(auVar105,auVar107);
        auVar76 = vfmadd213ps_fma(auVar48,auVar112,auVar101);
        auVar105 = vsubps_avx(auVar109,ZEXT1632(auVar76));
        auVar253 = ZEXT3264(auVar105);
        auVar85 = vfmadd213ps_avx512vl(auVar118,auVar47,auVar85);
        auVar102 = vmulps_avx512vl(auVar102,auVar85);
        auVar85 = vmulps_avx512vl(auVar88,auVar47);
        auVar109 = vmulps_avx512vl(auVar89,auVar47);
        auVar110 = vmulps_avx512vl(local_480,auVar47);
        auVar76 = vfmadd213ps_fma(auVar86,auVar102,auVar104);
        auVar105 = vsubps_avx(auVar85,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar100,auVar102,local_5e0);
        auVar85 = vsubps_avx512vl(auVar109,ZEXT1632(auVar76));
        auVar76 = vfmadd213ps_fma(auVar112,auVar102,auVar101);
        auVar86 = vsubps_avx512vl(auVar110,ZEXT1632(auVar76));
        auVar164._8_4_ = 0x7f800000;
        auVar164._0_8_ = 0x7f8000007f800000;
        auVar164._12_4_ = 0x7f800000;
        auVar164._16_4_ = 0x7f800000;
        auVar164._20_4_ = 0x7f800000;
        auVar164._24_4_ = 0x7f800000;
        auVar164._28_4_ = 0x7f800000;
        auVar100 = vblendmps_avx512vl(auVar164,auVar46);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar135._0_4_ = (uint)bVar71 * auVar100._0_4_ | (uint)!bVar71 * auVar104._0_4_;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar135._4_4_ = (uint)bVar71 * auVar100._4_4_ | (uint)!bVar71 * auVar104._4_4_;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar135._8_4_ = (uint)bVar71 * auVar100._8_4_ | (uint)!bVar71 * auVar104._8_4_;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar135._12_4_ = (uint)bVar71 * auVar100._12_4_ | (uint)!bVar71 * auVar104._12_4_;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar135._16_4_ = (uint)bVar71 * auVar100._16_4_ | (uint)!bVar71 * auVar104._16_4_;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar135._20_4_ = (uint)bVar71 * auVar100._20_4_ | (uint)!bVar71 * auVar104._20_4_;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar135._24_4_ = (uint)bVar71 * auVar100._24_4_ | (uint)!bVar71 * auVar104._24_4_;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar135._28_4_ = (uint)bVar71 * auVar100._28_4_ | (uint)!bVar71 * auVar104._28_4_;
        auVar165._8_4_ = 0xff800000;
        auVar165._0_8_ = 0xff800000ff800000;
        auVar165._12_4_ = 0xff800000;
        auVar165._16_4_ = 0xff800000;
        auVar165._20_4_ = 0xff800000;
        auVar165._24_4_ = 0xff800000;
        auVar165._28_4_ = 0xff800000;
        auVar100 = vblendmps_avx512vl(auVar165,auVar47);
        bVar71 = (bool)((byte)uVar72 & 1);
        auVar136._0_4_ = (uint)bVar71 * auVar100._0_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
        auVar136._4_4_ = (uint)bVar71 * auVar100._4_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
        auVar136._8_4_ = (uint)bVar71 * auVar100._8_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
        auVar136._12_4_ = (uint)bVar71 * auVar100._12_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
        auVar136._16_4_ = (uint)bVar71 * auVar100._16_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
        auVar136._20_4_ = (uint)bVar71 * auVar100._20_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
        auVar136._24_4_ = (uint)bVar71 * auVar100._24_4_ | (uint)!bVar71 * -0x800000;
        bVar71 = SUB81(uVar72 >> 7,0);
        auVar136._28_4_ = (uint)bVar71 * auVar100._28_4_ | (uint)!bVar71 * -0x800000;
        vandps_avx512vl(auVar115,local_600);
        auVar100 = vmaxps_avx(local_4a0,auVar136);
        auVar27._8_4_ = 0x36000000;
        auVar27._0_8_ = 0x3600000036000000;
        auVar27._12_4_ = 0x36000000;
        auVar27._16_4_ = 0x36000000;
        auVar27._20_4_ = 0x36000000;
        auVar27._24_4_ = 0x36000000;
        auVar27._28_4_ = 0x36000000;
        auVar100 = vmulps_avx512vl(auVar100,auVar27);
        vandps_avx512vl(auVar111,auVar115);
        uVar65 = vcmpps_avx512vl(auVar100,auVar100,1);
        uVar72 = uVar72 & uVar65;
        bVar61 = (byte)uVar72;
        if (bVar61 != 0) {
          uVar65 = vcmpps_avx512vl(auVar99,ZEXT1632(auVar77),2);
          auVar245._8_4_ = 0xff800000;
          auVar245._0_8_ = 0xff800000ff800000;
          auVar245._12_4_ = 0xff800000;
          auVar245._16_4_ = 0xff800000;
          auVar245._20_4_ = 0xff800000;
          auVar245._24_4_ = 0xff800000;
          auVar245._28_4_ = 0xff800000;
          auVar258._8_4_ = 0x7f800000;
          auVar258._0_8_ = 0x7f8000007f800000;
          auVar258._12_4_ = 0x7f800000;
          auVar258._16_4_ = 0x7f800000;
          auVar258._20_4_ = 0x7f800000;
          auVar258._24_4_ = 0x7f800000;
          auVar258._28_4_ = 0x7f800000;
          auVar259 = ZEXT3264(auVar258);
          auVar99 = vblendmps_avx512vl(auVar258,auVar245);
          bVar66 = (byte)uVar65;
          uVar73 = (uint)(bVar66 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar66 & 1) * auVar100._0_4_;
          bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
          uVar144 = (uint)bVar71 * auVar99._4_4_ | (uint)!bVar71 * auVar100._4_4_;
          bVar71 = (bool)((byte)(uVar65 >> 2) & 1);
          uVar145 = (uint)bVar71 * auVar99._8_4_ | (uint)!bVar71 * auVar100._8_4_;
          bVar71 = (bool)((byte)(uVar65 >> 3) & 1);
          uVar146 = (uint)bVar71 * auVar99._12_4_ | (uint)!bVar71 * auVar100._12_4_;
          bVar71 = (bool)((byte)(uVar65 >> 4) & 1);
          uVar147 = (uint)bVar71 * auVar99._16_4_ | (uint)!bVar71 * auVar100._16_4_;
          bVar71 = (bool)((byte)(uVar65 >> 5) & 1);
          uVar148 = (uint)bVar71 * auVar99._20_4_ | (uint)!bVar71 * auVar100._20_4_;
          bVar71 = (bool)((byte)(uVar65 >> 6) & 1);
          uVar149 = (uint)bVar71 * auVar99._24_4_ | (uint)!bVar71 * auVar100._24_4_;
          bVar71 = SUB81(uVar65 >> 7,0);
          uVar150 = (uint)bVar71 * auVar99._28_4_ | (uint)!bVar71 * auVar100._28_4_;
          auVar135._0_4_ = (bVar61 & 1) * uVar73 | !(bool)(bVar61 & 1) * auVar135._0_4_;
          bVar71 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar135._4_4_ = bVar71 * uVar144 | !bVar71 * auVar135._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar135._8_4_ = bVar71 * uVar145 | !bVar71 * auVar135._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar135._12_4_ = bVar71 * uVar146 | !bVar71 * auVar135._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar135._16_4_ = bVar71 * uVar147 | !bVar71 * auVar135._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar135._20_4_ = bVar71 * uVar148 | !bVar71 * auVar135._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar135._24_4_ = bVar71 * uVar149 | !bVar71 * auVar135._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar135._28_4_ = bVar71 * uVar150 | !bVar71 * auVar135._28_4_;
          auVar99 = vblendmps_avx512vl(auVar245,auVar258);
          bVar71 = (bool)((byte)(uVar65 >> 1) & 1);
          bVar9 = (bool)((byte)(uVar65 >> 2) & 1);
          bVar10 = (bool)((byte)(uVar65 >> 3) & 1);
          bVar11 = (bool)((byte)(uVar65 >> 4) & 1);
          bVar12 = (bool)((byte)(uVar65 >> 5) & 1);
          bVar13 = (bool)((byte)(uVar65 >> 6) & 1);
          bVar14 = SUB81(uVar65 >> 7,0);
          auVar136._0_4_ =
               (uint)(bVar61 & 1) *
               ((uint)(bVar66 & 1) * auVar99._0_4_ | !(bool)(bVar66 & 1) * uVar73) |
               !(bool)(bVar61 & 1) * auVar136._0_4_;
          bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
          auVar136._4_4_ =
               (uint)bVar8 * ((uint)bVar71 * auVar99._4_4_ | !bVar71 * uVar144) |
               !bVar8 * auVar136._4_4_;
          bVar71 = (bool)((byte)(uVar72 >> 2) & 1);
          auVar136._8_4_ =
               (uint)bVar71 * ((uint)bVar9 * auVar99._8_4_ | !bVar9 * uVar145) |
               !bVar71 * auVar136._8_4_;
          bVar71 = (bool)((byte)(uVar72 >> 3) & 1);
          auVar136._12_4_ =
               (uint)bVar71 * ((uint)bVar10 * auVar99._12_4_ | !bVar10 * uVar146) |
               !bVar71 * auVar136._12_4_;
          bVar71 = (bool)((byte)(uVar72 >> 4) & 1);
          auVar136._16_4_ =
               (uint)bVar71 * ((uint)bVar11 * auVar99._16_4_ | !bVar11 * uVar147) |
               !bVar71 * auVar136._16_4_;
          bVar71 = (bool)((byte)(uVar72 >> 5) & 1);
          auVar136._20_4_ =
               (uint)bVar71 * ((uint)bVar12 * auVar99._20_4_ | !bVar12 * uVar148) |
               !bVar71 * auVar136._20_4_;
          bVar71 = (bool)((byte)(uVar72 >> 6) & 1);
          auVar136._24_4_ =
               (uint)bVar71 * ((uint)bVar13 * auVar99._24_4_ | !bVar13 * uVar149) |
               !bVar71 * auVar136._24_4_;
          bVar71 = SUB81(uVar72 >> 7,0);
          auVar136._28_4_ =
               (uint)bVar71 * ((uint)bVar14 * auVar99._28_4_ | !bVar14 * uVar150) |
               !bVar71 * auVar136._28_4_;
          bVar67 = (~bVar61 | bVar66) & bVar67;
        }
      }
      auVar99 = vmulps_avx512vl(local_480,auVar86);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar89,auVar85);
      auVar99 = vfmadd231ps_avx512vl(auVar99,auVar88,auVar105);
      auVar236 = ZEXT3264(_local_620);
      _local_1c0 = _local_620;
      local_1a0 = vminps_avx(local_320,auVar135);
      vandps_avx512vl(auVar99,auVar115);
      _local_5a0 = vmaxps_avx(_local_620,auVar136);
      _local_340 = _local_5a0;
      auVar166._8_4_ = 0x3e99999a;
      auVar166._0_8_ = 0x3e99999a3e99999a;
      auVar166._12_4_ = 0x3e99999a;
      auVar166._16_4_ = 0x3e99999a;
      auVar166._20_4_ = 0x3e99999a;
      auVar166._24_4_ = 0x3e99999a;
      auVar166._28_4_ = 0x3e99999a;
      uVar16 = vcmpps_avx512vl(auVar99,auVar166,1);
      uVar18 = vcmpps_avx512vl(_local_620,local_1a0,2);
      bVar61 = (byte)uVar18 & bVar59;
      uVar17 = vcmpps_avx512vl(_local_5a0,local_320,2);
      if ((bVar59 & ((byte)uVar17 | (byte)uVar18)) == 0) {
LAB_01f14c4f:
        auVar223 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
      else {
        auVar99 = vmulps_avx512vl(local_480,auVar253._0_32_);
        auVar99 = vfmadd213ps_avx512vl(auVar107,auVar89,auVar99);
        auVar99 = vfmadd213ps_avx512vl(auVar103,auVar88,auVar99);
        vandps_avx512vl(auVar99,auVar115);
        uVar18 = vcmpps_avx512vl(auVar99,auVar166,1);
        bVar66 = (byte)uVar18 | ~bVar67;
        auVar167._8_4_ = 2;
        auVar167._0_8_ = 0x200000002;
        auVar167._12_4_ = 2;
        auVar167._16_4_ = 2;
        auVar167._20_4_ = 2;
        auVar167._24_4_ = 2;
        auVar167._28_4_ = 2;
        auVar28._8_4_ = 3;
        auVar28._0_8_ = 0x300000003;
        auVar28._12_4_ = 3;
        auVar28._16_4_ = 3;
        auVar28._20_4_ = 3;
        auVar28._24_4_ = 3;
        auVar28._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar167,auVar28);
        local_300._0_4_ = (uint)(bVar66 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar66 & 1) * 2;
        bVar71 = (bool)(bVar66 >> 1 & 1);
        local_300._4_4_ = (uint)bVar71 * auVar99._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar66 >> 2 & 1);
        local_300._8_4_ = (uint)bVar71 * auVar99._8_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar66 >> 3 & 1);
        local_300._12_4_ = (uint)bVar71 * auVar99._12_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar66 >> 4 & 1);
        local_300._16_4_ = (uint)bVar71 * auVar99._16_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar66 >> 5 & 1);
        local_300._20_4_ = (uint)bVar71 * auVar99._20_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar66 >> 6 & 1);
        local_300._24_4_ = (uint)bVar71 * auVar99._24_4_ | (uint)!bVar71 * 2;
        local_300._28_4_ = (uint)(bVar66 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar66 >> 7) * 2;
        local_4c0 = vpbroadcastd_avx512vl();
        uVar18 = vpcmpd_avx512vl(local_4c0,local_300,5);
        bVar66 = (byte)uVar18 & bVar61;
        auVar139._16_16_ = auVar98._16_16_;
        if (bVar66 == 0) {
          auVar226._8_4_ = 0x7fffffff;
          auVar226._0_8_ = 0x7fffffff7fffffff;
          auVar226._12_4_ = 0x7fffffff;
        }
        else {
          auVar77 = vminps_avx(local_700._0_16_,local_740._0_16_);
          auVar76 = vmaxps_avx(local_700._0_16_,local_740._0_16_);
          auVar84 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar159 = vminps_avx(auVar77,auVar84);
          auVar77 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar84 = vmaxps_avx(auVar76,auVar77);
          auVar192._8_4_ = 0x7fffffff;
          auVar192._0_8_ = 0x7fffffff7fffffff;
          auVar192._12_4_ = 0x7fffffff;
          auVar76 = vandps_avx(auVar159,auVar192);
          auVar77 = vandps_avx(auVar84,auVar192);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar234 = auVar76._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar84,auVar84,0xff);
          local_580 = (float)local_620._0_4_ + (float)local_5c0._0_4_;
          fStack_57c = (float)local_620._4_4_ + (float)local_5c0._4_4_;
          fStack_578 = fStack_618 + fStack_5b8;
          fStack_574 = fStack_614 + fStack_5b4;
          fStack_570 = fStack_610 + fStack_5b0;
          fStack_56c = fStack_60c + fStack_5ac;
          fStack_568 = fStack_608 + fStack_5a8;
          fStack_564 = fStack_604 + fStack_5a4;
          do {
            auVar168._8_4_ = 0x7f800000;
            auVar168._0_8_ = 0x7f8000007f800000;
            auVar168._12_4_ = 0x7f800000;
            auVar168._16_4_ = 0x7f800000;
            auVar168._20_4_ = 0x7f800000;
            auVar168._24_4_ = 0x7f800000;
            auVar168._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar168,_local_620);
            auVar137._0_4_ =
                 (uint)(bVar66 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar66 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar66 >> 1 & 1);
            auVar137._4_4_ = (uint)bVar71 * auVar99._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar66 >> 2 & 1);
            auVar137._8_4_ = (uint)bVar71 * auVar99._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar66 >> 3 & 1);
            auVar137._12_4_ = (uint)bVar71 * auVar99._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar66 >> 4 & 1);
            auVar137._16_4_ = (uint)bVar71 * auVar99._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar66 >> 5 & 1);
            auVar137._20_4_ = (uint)bVar71 * auVar99._20_4_ | (uint)!bVar71 * 0x7f800000;
            auVar137._24_4_ =
                 (uint)(bVar66 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar66 >> 6) * 0x7f800000;
            auVar137._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar137,auVar137,0xb1);
            auVar99 = vminps_avx(auVar137,auVar99);
            auVar85 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar85);
            auVar85 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar85);
            uVar18 = vcmpps_avx512vl(auVar137,auVar99,0);
            bVar60 = (byte)uVar18 & bVar66;
            bVar69 = bVar66;
            if (bVar60 != 0) {
              bVar69 = bVar60;
            }
            iVar19 = 0;
            for (uVar73 = (uint)bVar69; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar69 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar73 = *(uint *)(local_540 + (uint)(iVar19 << 2));
            uVar144 = *(uint *)(local_1c0 + (uint)(iVar19 << 2));
            fVar237 = auVar15._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              fVar237 = sqrtf((float)local_780._0_4_);
            }
            auVar253 = ZEXT464(uVar73);
            auVar249 = ZEXT464(uVar144);
            bVar60 = ~bVar69;
            lVar70 = 5;
            do {
              fVar238 = auVar249._0_4_;
              auVar154._4_4_ = fVar238;
              auVar154._0_4_ = fVar238;
              auVar154._8_4_ = fVar238;
              auVar154._12_4_ = fVar238;
              auVar76 = vfmadd132ps_fma(auVar154,ZEXT816(0) << 0x40,local_770);
              fVar251 = auVar253._0_4_;
              fVar209 = 1.0 - fVar251;
              auVar78 = SUB6416(ZEXT464(0x40400000),0);
              auVar75 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar252 = auVar253._0_16_;
              auVar84 = vfmadd213ss_fma(auVar78,auVar252,auVar75);
              auVar77 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar251 * fVar251)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar159 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar209),auVar75);
              auVar159 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar209 * fVar209)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar239 = fVar209 * fVar209 * -fVar251 * 0.5;
              fVar240 = auVar77._0_4_ * 0.5;
              fVar241 = auVar159._0_4_ * 0.5;
              fVar257 = fVar251 * fVar251 * -fVar209 * 0.5;
              auVar211._0_4_ = fVar257 * (float)local_760._0_4_;
              auVar211._4_4_ = fVar257 * (float)local_760._4_4_;
              auVar211._8_4_ = fVar257 * fStack_758;
              auVar211._12_4_ = fVar257 * fStack_754;
              auVar225._4_4_ = fVar241;
              auVar225._0_4_ = fVar241;
              auVar225._8_4_ = fVar241;
              auVar225._12_4_ = fVar241;
              auVar77 = vfmadd132ps_fma(auVar225,auVar211,local_720._0_16_);
              auVar193._4_4_ = fVar240;
              auVar193._0_4_ = fVar240;
              auVar193._8_4_ = fVar240;
              auVar193._12_4_ = fVar240;
              auVar77 = vfmadd132ps_fma(auVar193,auVar77,local_740._0_16_);
              auVar212._4_4_ = fVar239;
              auVar212._0_4_ = fVar239;
              auVar212._8_4_ = fVar239;
              auVar212._12_4_ = fVar239;
              auVar77 = vfmadd132ps_fma(auVar212,auVar77,local_700._0_16_);
              auVar159 = vfmadd231ss_fma(auVar75,auVar252,ZEXT416(0x41100000));
              local_600._0_16_ = auVar159;
              local_640 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar252,
                                          ZEXT416(0x40800000));
              local_650 = vfmadd213ss_fma(auVar78,auVar252,ZEXT416(0xbf800000));
              local_5e0._0_16_ = auVar77;
              auVar77 = vsubps_avx(auVar76,auVar77);
              auVar76 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar239 = auVar76._0_4_;
              if (fVar239 < 0.0) {
                auVar249._0_4_ = sqrtf(fVar239);
                auVar249._4_60_ = extraout_var;
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar159 = auVar249._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar76,auVar76);
              }
              auVar79 = vfnmadd231ss_fma(ZEXT416((uint)(fVar251 * (fVar209 + fVar209))),
                                         ZEXT416((uint)fVar209),ZEXT416((uint)fVar209));
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar251 + fVar251)),
                                        ZEXT416((uint)(fVar251 * fVar251 * 3.0)));
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar252,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                        ZEXT416((uint)(fVar209 + fVar209)),auVar75);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar209 * -2.0)),auVar252,
                                        ZEXT416((uint)(fVar251 * fVar251)));
              fVar240 = auVar79._0_4_ * 0.5;
              fVar241 = auVar84._0_4_ * 0.5;
              fVar257 = auVar78._0_4_ * 0.5;
              fVar209 = auVar75._0_4_ * 0.5;
              auVar213._0_4_ = fVar209 * (float)local_760._0_4_;
              auVar213._4_4_ = fVar209 * (float)local_760._4_4_;
              auVar213._8_4_ = fVar209 * fStack_758;
              auVar213._12_4_ = fVar209 * fStack_754;
              auVar194._4_4_ = fVar257;
              auVar194._0_4_ = fVar257;
              auVar194._8_4_ = fVar257;
              auVar194._12_4_ = fVar257;
              auVar84 = vfmadd132ps_fma(auVar194,auVar213,local_720._0_16_);
              auVar173._4_4_ = fVar241;
              auVar173._0_4_ = fVar241;
              auVar173._8_4_ = fVar241;
              auVar173._12_4_ = fVar241;
              auVar84 = vfmadd132ps_fma(auVar173,auVar84,local_740._0_16_);
              auVar260._4_4_ = fVar240;
              auVar260._0_4_ = fVar240;
              auVar260._8_4_ = fVar240;
              auVar260._12_4_ = fVar240;
              auVar75 = vfmadd132ps_fma(auVar260,auVar84,local_700._0_16_);
              auVar84 = vdpps_avx(auVar75,auVar75,0x7f);
              auVar50._12_4_ = 0;
              auVar50._0_12_ = ZEXT812(0);
              fVar240 = auVar84._0_4_;
              auVar78 = vrsqrt14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar240));
              fVar241 = auVar78._0_4_;
              auVar79 = vrcp14ss_avx512f(auVar50 << 0x20,ZEXT416((uint)fVar240));
              auVar20._8_4_ = 0x80000000;
              auVar20._0_8_ = 0x8000000080000000;
              auVar20._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar84,auVar20);
              auVar78 = vfnmadd213ss_fma(auVar79,auVar84,SUB6416(ZEXT464(0x40000000),0));
              uVar73 = auVar159._0_4_;
              if (fVar240 < auVar80._0_4_) {
                fVar257 = sqrtf(fVar240);
                auVar159 = ZEXT416(uVar73);
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar257 = auVar84._0_4_;
              }
              fVar241 = fVar241 * 1.5 + fVar240 * -0.5 * fVar241 * fVar241 * fVar241;
              auVar155._0_4_ = auVar75._0_4_ * fVar241;
              auVar155._4_4_ = auVar75._4_4_ * fVar241;
              auVar155._8_4_ = auVar75._8_4_ * fVar241;
              auVar155._12_4_ = auVar75._12_4_ * fVar241;
              auVar84 = vdpps_avx(auVar77,auVar155,0x7f);
              fVar242 = auVar159._0_4_;
              auVar156._0_4_ = auVar84._0_4_ * auVar84._0_4_;
              auVar156._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar156._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar156._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar81 = vsubps_avx512vl(auVar76,auVar156);
              fVar209 = auVar81._0_4_;
              auVar174._4_12_ = ZEXT812(0) << 0x20;
              auVar174._0_4_ = fVar209;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar174);
              auVar82 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              if (fVar209 < 0.0) {
                local_680 = fVar241;
                fStack_67c = fVar241;
                fStack_678 = fVar241;
                fStack_674 = fVar241;
                local_670 = auVar80;
                local_660 = auVar84;
                fVar153 = sqrtf(fVar209);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar159 = ZEXT416(uVar73);
                auVar84 = local_660;
                auVar80 = local_670;
                fVar241 = local_680;
                fVar246 = fStack_67c;
                fVar247 = fStack_678;
                fVar248 = fStack_674;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar153 = auVar81._0_4_;
                fVar246 = fVar241;
                fVar247 = fVar241;
                fVar248 = fVar241;
              }
              auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar263 = ZEXT3264(auVar99);
              auVar175._0_4_ = (float)local_650._0_4_ * (float)local_760._0_4_;
              auVar175._4_4_ = (float)local_650._0_4_ * (float)local_760._4_4_;
              auVar175._8_4_ = (float)local_650._0_4_ * fStack_758;
              auVar175._12_4_ = (float)local_650._0_4_ * fStack_754;
              auVar195._4_4_ = local_640._0_4_;
              auVar195._0_4_ = local_640._0_4_;
              auVar195._8_4_ = local_640._0_4_;
              auVar195._12_4_ = local_640._0_4_;
              auVar81 = vfmadd132ps_fma(auVar195,auVar175,local_720._0_16_);
              auVar176._4_4_ = local_600._0_4_;
              auVar176._0_4_ = local_600._0_4_;
              auVar176._8_4_ = local_600._0_4_;
              auVar176._12_4_ = local_600._0_4_;
              auVar81 = vfmadd132ps_fma(auVar176,auVar81,local_740._0_16_);
              auVar252 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar252,ZEXT416(0x40000000)
                                        );
              auVar196._0_4_ = auVar252._0_4_;
              auVar196._4_4_ = auVar196._0_4_;
              auVar196._8_4_ = auVar196._0_4_;
              auVar196._12_4_ = auVar196._0_4_;
              auVar252 = vfmadd132ps_fma(auVar196,auVar81,local_700._0_16_);
              auVar177._0_4_ = auVar252._0_4_ * fVar240;
              auVar177._4_4_ = auVar252._4_4_ * fVar240;
              auVar177._8_4_ = auVar252._8_4_ * fVar240;
              auVar177._12_4_ = auVar252._12_4_ * fVar240;
              auVar252 = vdpps_avx(auVar75,auVar252,0x7f);
              fVar240 = auVar252._0_4_;
              auVar197._0_4_ = auVar75._0_4_ * fVar240;
              auVar197._4_4_ = auVar75._4_4_ * fVar240;
              auVar197._8_4_ = auVar75._8_4_ * fVar240;
              auVar197._12_4_ = auVar75._12_4_ * fVar240;
              auVar252 = vsubps_avx(auVar177,auVar197);
              local_9e0 = auVar79._0_4_;
              local_9e0 = auVar78._0_4_ * local_9e0;
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar234),
                                   ZEXT416((uint)(fVar238 * fVar237 * 1.9073486e-06)));
              auVar21._8_4_ = 0x80000000;
              auVar21._0_8_ = 0x8000000080000000;
              auVar21._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(auVar75,auVar21);
              auVar198._0_4_ = fVar241 * auVar252._0_4_ * local_9e0;
              auVar198._4_4_ = fVar246 * auVar252._4_4_ * local_9e0;
              auVar198._8_4_ = fVar247 * auVar252._8_4_ * local_9e0;
              auVar198._12_4_ = fVar248 * auVar252._12_4_ * local_9e0;
              auVar259 = ZEXT1664(auVar155);
              auVar78 = vdpps_avx(auVar83,auVar155,0x7f);
              auVar252 = vfmadd213ss_fma(auVar159,ZEXT416((uint)fVar234),auVar79);
              auVar159 = vdpps_avx(auVar77,auVar198,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar242 + 1.0)),
                                        ZEXT416((uint)(fVar234 / fVar257)),auVar252);
              fVar240 = auVar78._0_4_ + auVar159._0_4_;
              auVar159 = vdpps_avx(local_770,auVar155,0x7f);
              auVar78 = vdpps_avx(auVar77,auVar83,0x7f);
              fVar241 = auVar80._0_4_;
              auVar83 = vaddss_avx512f(auVar82,ZEXT416((uint)(fVar241 * fVar209 * -0.5 *
                                                             fVar241 * fVar241)));
              auVar252 = vdpps_avx(auVar77,local_770,0x7f);
              auVar80 = vfnmadd231ss_fma(auVar78,auVar84,ZEXT416((uint)fVar240));
              auVar82 = vfnmadd231ss_fma(auVar252,auVar84,auVar159);
              auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar153 = fVar153 - auVar78._0_4_;
              auVar78 = vshufps_avx(auVar75,auVar75,0xff);
              auVar252 = vfmsub213ss_fma(auVar80,auVar83,auVar78);
              fVar241 = auVar82._0_4_ * auVar83._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar159._0_4_ * auVar252._0_4_)),
                                        ZEXT416((uint)fVar240),ZEXT416((uint)fVar241));
              fVar257 = auVar80._0_4_;
              fVar241 = auVar84._0_4_ * (fVar241 / fVar257);
              auVar236 = ZEXT464((uint)fVar241);
              fVar251 = fVar251 - (fVar241 - fVar153 * (auVar159._0_4_ / fVar257));
              auVar253 = ZEXT464((uint)fVar251);
              fVar238 = fVar238 - (fVar153 * (fVar240 / fVar257) -
                                  auVar84._0_4_ * (auVar252._0_4_ / fVar257));
              auVar249 = ZEXT464((uint)fVar238);
              auVar226._8_4_ = 0x7fffffff;
              auVar226._0_8_ = 0x7fffffff7fffffff;
              auVar226._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx(auVar84,auVar226);
              bVar71 = true;
              if (auVar84._0_4_ < auVar81._0_4_) {
                auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar79._0_4_)),local_6a0,
                                           ZEXT416(0x36000000));
                auVar84 = vandps_avx(ZEXT416((uint)fVar153),auVar226);
                if (auVar84._0_4_ < auVar159._0_4_) {
                  fVar238 = fVar238 + (float)local_690._0_4_;
                  auVar249 = ZEXT464((uint)fVar238);
                  if ((((fVar151 <= fVar238) &&
                       (fVar240 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar240)) &&
                      (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                    auVar139._0_16_ = ZEXT816(0) << 0x20;
                    auVar138._4_28_ = auVar139._4_28_;
                    auVar138._0_4_ = fVar239;
                    auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar138._0_16_);
                    fVar239 = auVar84._0_4_;
                    auVar76 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar69 = true;
                      }
                      else {
                        fVar239 = fVar239 * 1.5 + auVar76._0_4_ * fVar239 * fVar239 * fVar239;
                        auVar178._0_4_ = auVar77._0_4_ * fVar239;
                        auVar178._4_4_ = auVar77._4_4_ * fVar239;
                        auVar178._8_4_ = auVar77._8_4_ * fVar239;
                        auVar178._12_4_ = auVar77._12_4_ * fVar239;
                        auVar159 = vfmadd213ps_fma(auVar78,auVar178,auVar75);
                        auVar76 = vshufps_avx(auVar178,auVar178,0xc9);
                        auVar77 = vshufps_avx(auVar75,auVar75,0xc9);
                        auVar179._0_4_ = auVar178._0_4_ * auVar77._0_4_;
                        auVar179._4_4_ = auVar178._4_4_ * auVar77._4_4_;
                        auVar179._8_4_ = auVar178._8_4_ * auVar77._8_4_;
                        auVar179._12_4_ = auVar178._12_4_ * auVar77._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar179,auVar75,auVar76);
                        auVar76 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar77 = vshufps_avx(auVar159,auVar159,0xc9);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar157._0_4_ = auVar159._0_4_ * auVar84._0_4_;
                        auVar157._4_4_ = auVar159._4_4_ * auVar84._4_4_;
                        auVar157._8_4_ = auVar159._8_4_ * auVar84._8_4_;
                        auVar157._12_4_ = auVar159._12_4_ * auVar84._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar157,auVar76,auVar77);
                        auVar206._8_4_ = 1;
                        auVar206._0_8_ = 0x100000001;
                        auVar206._12_4_ = 1;
                        auVar206._16_4_ = 1;
                        auVar206._20_4_ = 1;
                        auVar206._24_4_ = 1;
                        auVar206._28_4_ = 1;
                        auVar99 = vpermps_avx2(auVar206,ZEXT1632(auVar76));
                        auVar220._8_4_ = 2;
                        auVar220._0_8_ = 0x200000002;
                        auVar220._12_4_ = 2;
                        auVar220._16_4_ = 2;
                        auVar220._20_4_ = 2;
                        auVar220._24_4_ = 2;
                        auVar220._28_4_ = 2;
                        local_440 = vpermps_avx2(auVar220,ZEXT1632(auVar76));
                        local_420 = auVar76._0_4_;
                        local_460[0] = (RTCHitN)auVar99[0];
                        local_460[1] = (RTCHitN)auVar99[1];
                        local_460[2] = (RTCHitN)auVar99[2];
                        local_460[3] = (RTCHitN)auVar99[3];
                        local_460[4] = (RTCHitN)auVar99[4];
                        local_460[5] = (RTCHitN)auVar99[5];
                        local_460[6] = (RTCHitN)auVar99[6];
                        local_460[7] = (RTCHitN)auVar99[7];
                        local_460[8] = (RTCHitN)auVar99[8];
                        local_460[9] = (RTCHitN)auVar99[9];
                        local_460[10] = (RTCHitN)auVar99[10];
                        local_460[0xb] = (RTCHitN)auVar99[0xb];
                        local_460[0xc] = (RTCHitN)auVar99[0xc];
                        local_460[0xd] = (RTCHitN)auVar99[0xd];
                        local_460[0xe] = (RTCHitN)auVar99[0xe];
                        local_460[0xf] = (RTCHitN)auVar99[0xf];
                        local_460[0x10] = (RTCHitN)auVar99[0x10];
                        local_460[0x11] = (RTCHitN)auVar99[0x11];
                        local_460[0x12] = (RTCHitN)auVar99[0x12];
                        local_460[0x13] = (RTCHitN)auVar99[0x13];
                        local_460[0x14] = (RTCHitN)auVar99[0x14];
                        local_460[0x15] = (RTCHitN)auVar99[0x15];
                        local_460[0x16] = (RTCHitN)auVar99[0x16];
                        local_460[0x17] = (RTCHitN)auVar99[0x17];
                        local_460[0x18] = (RTCHitN)auVar99[0x18];
                        local_460[0x19] = (RTCHitN)auVar99[0x19];
                        local_460[0x1a] = (RTCHitN)auVar99[0x1a];
                        local_460[0x1b] = (RTCHitN)auVar99[0x1b];
                        local_460[0x1c] = (RTCHitN)auVar99[0x1c];
                        local_460[0x1d] = (RTCHitN)auVar99[0x1d];
                        local_460[0x1e] = (RTCHitN)auVar99[0x1e];
                        local_460[0x1f] = (RTCHitN)auVar99[0x1f];
                        uStack_41c = local_420;
                        uStack_418 = local_420;
                        uStack_414 = local_420;
                        uStack_410 = local_420;
                        uStack_40c = local_420;
                        uStack_408 = local_420;
                        uStack_404 = local_420;
                        local_400 = fVar251;
                        fStack_3fc = fVar251;
                        fStack_3f8 = fVar251;
                        fStack_3f4 = fVar251;
                        fStack_3f0 = fVar251;
                        fStack_3ec = fVar251;
                        fStack_3e8 = fVar251;
                        fStack_3e4 = fVar251;
                        local_3e0 = ZEXT432(0) << 0x20;
                        local_3c0 = local_4e0._0_8_;
                        uStack_3b8 = local_4e0._8_8_;
                        uStack_3b0 = local_4e0._16_8_;
                        uStack_3a8 = local_4e0._24_8_;
                        local_3a0 = local_500;
                        vpcmpeqd_avx2(local_500,local_500);
                        local_380 = context->user->instID[0];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        local_360 = context->user->instPrimID[0];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        local_6e0 = local_520._0_8_;
                        uStack_6d8 = local_520._8_8_;
                        uStack_6d0 = local_520._16_8_;
                        uStack_6c8 = local_520._24_8_;
                        local_7b0.valid = (int *)&local_6e0;
                        local_7b0.geometryUserPtr = pGVar3->userPtr;
                        local_7b0.context = context->user;
                        local_7b0.hit = local_460;
                        local_7b0.N = 8;
                        local_7b0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar236 = ZEXT464((uint)fVar241);
                          auVar259 = ZEXT1664(auVar155);
                          (*pGVar3->occlusionFilterN)(&local_7b0);
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar238));
                          auVar253 = ZEXT1664(ZEXT416((uint)fVar251));
                          auVar226._8_4_ = 0x7fffffff;
                          auVar226._0_8_ = 0x7fffffff7fffffff;
                          auVar226._12_4_ = 0x7fffffff;
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar263 = ZEXT3264(auVar99);
                        }
                        auVar52._8_8_ = uStack_6d8;
                        auVar52._0_8_ = local_6e0;
                        auVar52._16_8_ = uStack_6d0;
                        auVar52._24_8_ = uStack_6c8;
                        if (auVar52 == (undefined1  [32])0x0) {
                          bVar69 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar236 = ZEXT1664(auVar236._0_16_);
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            (*p_Var7)(&local_7b0);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar238));
                            auVar253 = ZEXT1664(ZEXT416((uint)fVar251));
                            auVar226._8_4_ = 0x7fffffff;
                            auVar226._0_8_ = 0x7fffffff7fffffff;
                            auVar226._12_4_ = 0x7fffffff;
                            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar263 = ZEXT3264(auVar99);
                          }
                          auVar53._8_8_ = uStack_6d8;
                          auVar53._0_8_ = local_6e0;
                          auVar53._16_8_ = uStack_6d0;
                          auVar53._24_8_ = uStack_6c8;
                          uVar72 = vptestmd_avx512vl(auVar53,auVar53);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar71 = (bool)((byte)uVar72 & 1);
                          bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar10 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar14 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_7b0.ray + 0x100) =
                               (uint)bVar71 * auVar99._0_4_ |
                               (uint)!bVar71 * *(int *)(local_7b0.ray + 0x100);
                          *(uint *)(local_7b0.ray + 0x104) =
                               (uint)bVar8 * auVar99._4_4_ |
                               (uint)!bVar8 * *(int *)(local_7b0.ray + 0x104);
                          *(uint *)(local_7b0.ray + 0x108) =
                               (uint)bVar9 * auVar99._8_4_ |
                               (uint)!bVar9 * *(int *)(local_7b0.ray + 0x108);
                          *(uint *)(local_7b0.ray + 0x10c) =
                               (uint)bVar10 * auVar99._12_4_ |
                               (uint)!bVar10 * *(int *)(local_7b0.ray + 0x10c);
                          *(uint *)(local_7b0.ray + 0x110) =
                               (uint)bVar11 * auVar99._16_4_ |
                               (uint)!bVar11 * *(int *)(local_7b0.ray + 0x110);
                          *(uint *)(local_7b0.ray + 0x114) =
                               (uint)bVar12 * auVar99._20_4_ |
                               (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                          *(uint *)(local_7b0.ray + 0x118) =
                               (uint)bVar13 * auVar99._24_4_ |
                               (uint)!bVar13 * *(int *)(local_7b0.ray + 0x118);
                          *(uint *)(local_7b0.ray + 0x11c) =
                               (uint)bVar14 * auVar99._28_4_ |
                               (uint)!bVar14 * *(int *)(local_7b0.ray + 0x11c);
                          bVar69 = auVar53 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar69 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar240;
                        }
                      }
                      bVar71 = false;
                      goto LAB_01f13b0c;
                    }
                  }
                  bVar71 = false;
                  bVar69 = 0;
                }
              }
LAB_01f13b0c:
              if (!bVar71) goto LAB_01f13efb;
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
            bVar69 = 0;
LAB_01f13efb:
            bVar68 = bVar68 | bVar69 & 1;
            auVar56._4_4_ = fStack_57c;
            auVar56._0_4_ = local_580;
            auVar56._8_4_ = fStack_578;
            auVar56._12_4_ = fStack_574;
            auVar56._16_4_ = fStack_570;
            auVar56._20_4_ = fStack_56c;
            auVar56._24_4_ = fStack_568;
            auVar56._28_4_ = fStack_564;
            uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar29._4_4_ = uVar152;
            auVar29._0_4_ = uVar152;
            auVar29._8_4_ = uVar152;
            auVar29._12_4_ = uVar152;
            auVar29._16_4_ = uVar152;
            auVar29._20_4_ = uVar152;
            auVar29._24_4_ = uVar152;
            auVar29._28_4_ = uVar152;
            uVar18 = vcmpps_avx512vl(auVar56,auVar29,2);
            bVar66 = bVar60 & bVar66 & (byte)uVar18;
          } while (bVar66 != 0);
        }
        auVar169._0_4_ = (float)local_5c0._0_4_ + (float)local_5a0._0_4_;
        auVar169._4_4_ = (float)local_5c0._4_4_ + (float)local_5a0._4_4_;
        auVar169._8_4_ = fStack_5b8 + fStack_598;
        auVar169._12_4_ = fStack_5b4 + fStack_594;
        auVar169._16_4_ = fStack_5b0 + fStack_590;
        auVar169._20_4_ = fStack_5ac + fStack_58c;
        auVar169._24_4_ = fStack_5a8 + fStack_588;
        auVar169._28_4_ = fStack_5a4 + fStack_584;
        uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar30._4_4_ = uVar152;
        auVar30._0_4_ = uVar152;
        auVar30._8_4_ = uVar152;
        auVar30._12_4_ = uVar152;
        auVar30._16_4_ = uVar152;
        auVar30._20_4_ = uVar152;
        auVar30._24_4_ = uVar152;
        auVar30._28_4_ = uVar152;
        uVar18 = vcmpps_avx512vl(auVar169,auVar30,2);
        bVar67 = (byte)uVar16 | ~bVar67;
        bVar59 = (byte)uVar17 & bVar59 & (byte)uVar18;
        auVar170._8_4_ = 2;
        auVar170._0_8_ = 0x200000002;
        auVar170._12_4_ = 2;
        auVar170._16_4_ = 2;
        auVar170._20_4_ = 2;
        auVar170._24_4_ = 2;
        auVar170._28_4_ = 2;
        auVar31._8_4_ = 3;
        auVar31._0_8_ = 0x300000003;
        auVar31._12_4_ = 3;
        auVar31._16_4_ = 3;
        auVar31._20_4_ = 3;
        auVar31._24_4_ = 3;
        auVar31._28_4_ = 3;
        auVar99 = vpblendmd_avx512vl(auVar170,auVar31);
        local_5a0._0_4_ = (uint)(bVar67 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar67 & 1) * 2;
        bVar71 = (bool)(bVar67 >> 1 & 1);
        local_5a0._4_4_ = (uint)bVar71 * auVar99._4_4_ | (uint)!bVar71 * 2;
        bVar71 = (bool)(bVar67 >> 2 & 1);
        fStack_598 = (float)((uint)bVar71 * auVar99._8_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar67 >> 3 & 1);
        fStack_594 = (float)((uint)bVar71 * auVar99._12_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar67 >> 4 & 1);
        fStack_590 = (float)((uint)bVar71 * auVar99._16_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar67 >> 5 & 1);
        fStack_58c = (float)((uint)bVar71 * auVar99._20_4_ | (uint)!bVar71 * 2);
        bVar71 = (bool)(bVar67 >> 6 & 1);
        fStack_588 = (float)((uint)bVar71 * auVar99._24_4_ | (uint)!bVar71 * 2);
        fStack_584 = (float)((uint)(bVar67 >> 7) * auVar99._28_4_ | (uint)!(bool)(bVar67 >> 7) * 2);
        uVar16 = vpcmpd_avx512vl(_local_5a0,local_4c0,2);
        bVar67 = (byte)uVar16 & bVar59;
        if (bVar67 != 0) {
          auVar77 = vminps_avx(local_700._0_16_,local_740._0_16_);
          auVar76 = vmaxps_avx(local_700._0_16_,local_740._0_16_);
          auVar84 = vminps_avx(local_720._0_16_,local_760._0_16_);
          auVar159 = vminps_avx(auVar77,auVar84);
          auVar77 = vmaxps_avx(local_720._0_16_,local_760._0_16_);
          auVar84 = vmaxps_avx(auVar76,auVar77);
          auVar76 = vandps_avx(auVar159,auVar226);
          auVar77 = vandps_avx(auVar84,auVar226);
          auVar76 = vmaxps_avx(auVar76,auVar77);
          auVar77 = vmovshdup_avx(auVar76);
          auVar77 = vmaxss_avx(auVar77,auVar76);
          auVar76 = vshufpd_avx(auVar76,auVar76,1);
          auVar76 = vmaxss_avx(auVar76,auVar77);
          fVar234 = auVar76._0_4_ * 1.9073486e-06;
          local_6a0 = vshufps_avx(auVar84,auVar84,0xff);
          _local_620 = _local_340;
          local_580 = (float)local_5c0._0_4_ + (float)local_340._0_4_;
          fStack_57c = (float)local_5c0._4_4_ + (float)local_340._4_4_;
          fStack_578 = fStack_5b8 + fStack_338;
          fStack_574 = fStack_5b4 + fStack_334;
          fStack_570 = fStack_5b0 + fStack_330;
          fStack_56c = fStack_5ac + fStack_32c;
          fStack_568 = fStack_5a8 + fStack_328;
          fStack_564 = fStack_5a4 + fStack_324;
          do {
            auVar171._8_4_ = 0x7f800000;
            auVar171._0_8_ = 0x7f8000007f800000;
            auVar171._12_4_ = 0x7f800000;
            auVar171._16_4_ = 0x7f800000;
            auVar171._20_4_ = 0x7f800000;
            auVar171._24_4_ = 0x7f800000;
            auVar171._28_4_ = 0x7f800000;
            auVar99 = vblendmps_avx512vl(auVar171,_local_620);
            auVar140._0_4_ =
                 (uint)(bVar67 & 1) * auVar99._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
            bVar71 = (bool)(bVar67 >> 1 & 1);
            auVar140._4_4_ = (uint)bVar71 * auVar99._4_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar67 >> 2 & 1);
            auVar140._8_4_ = (uint)bVar71 * auVar99._8_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar67 >> 3 & 1);
            auVar140._12_4_ = (uint)bVar71 * auVar99._12_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar67 >> 4 & 1);
            auVar140._16_4_ = (uint)bVar71 * auVar99._16_4_ | (uint)!bVar71 * 0x7f800000;
            bVar71 = (bool)(bVar67 >> 5 & 1);
            auVar140._20_4_ = (uint)bVar71 * auVar99._20_4_ | (uint)!bVar71 * 0x7f800000;
            auVar140._24_4_ =
                 (uint)(bVar67 >> 6) * auVar99._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
            auVar140._28_4_ = 0x7f800000;
            auVar99 = vshufps_avx(auVar140,auVar140,0xb1);
            auVar99 = vminps_avx(auVar140,auVar99);
            auVar85 = vshufpd_avx(auVar99,auVar99,5);
            auVar99 = vminps_avx(auVar99,auVar85);
            auVar85 = vpermpd_avx2(auVar99,0x4e);
            auVar99 = vminps_avx(auVar99,auVar85);
            uVar16 = vcmpps_avx512vl(auVar140,auVar99,0);
            bVar69 = (byte)uVar16 & bVar67;
            bVar66 = bVar67;
            if (bVar69 != 0) {
              bVar66 = bVar69;
            }
            iVar19 = 0;
            for (uVar73 = (uint)bVar66; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
              iVar19 = iVar19 + 1;
            }
            bVar66 = '\x01' << ((byte)iVar19 & 0x1f);
            uVar73 = *(uint *)(local_560 + (uint)(iVar19 << 2));
            uVar144 = *(uint *)(local_320 + (uint)(iVar19 << 2));
            fVar237 = auVar74._0_4_;
            if ((float)local_780._0_4_ < 0.0) {
              fVar237 = sqrtf((float)local_780._0_4_);
            }
            auVar253 = ZEXT464(uVar73);
            auVar249 = ZEXT464(uVar144);
            bVar69 = ~bVar66;
            lVar70 = 5;
            do {
              fVar238 = auVar249._0_4_;
              auVar158._4_4_ = fVar238;
              auVar158._0_4_ = fVar238;
              auVar158._8_4_ = fVar238;
              auVar158._12_4_ = fVar238;
              auVar76 = vfmadd132ps_fma(auVar158,ZEXT816(0) << 0x40,local_770);
              fVar251 = auVar253._0_4_;
              fVar209 = 1.0 - fVar251;
              auVar78 = SUB6416(ZEXT464(0x40400000),0);
              auVar75 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar252 = auVar253._0_16_;
              auVar84 = vfmadd213ss_fma(auVar78,auVar252,auVar75);
              auVar77 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar251 * fVar251)),
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar159 = vfmadd213ss_fma(auVar78,ZEXT416((uint)fVar209),auVar75);
              auVar159 = vfmadd213ss_fma(auVar159,ZEXT416((uint)(fVar209 * fVar209)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar239 = fVar209 * fVar209 * -fVar251 * 0.5;
              fVar240 = auVar77._0_4_ * 0.5;
              fVar241 = auVar159._0_4_ * 0.5;
              fVar257 = fVar251 * fVar251 * -fVar209 * 0.5;
              auVar214._0_4_ = fVar257 * (float)local_760._0_4_;
              auVar214._4_4_ = fVar257 * (float)local_760._4_4_;
              auVar214._8_4_ = fVar257 * fStack_758;
              auVar214._12_4_ = fVar257 * fStack_754;
              auVar227._4_4_ = fVar241;
              auVar227._0_4_ = fVar241;
              auVar227._8_4_ = fVar241;
              auVar227._12_4_ = fVar241;
              auVar77 = vfmadd132ps_fma(auVar227,auVar214,local_720._0_16_);
              auVar199._4_4_ = fVar240;
              auVar199._0_4_ = fVar240;
              auVar199._8_4_ = fVar240;
              auVar199._12_4_ = fVar240;
              auVar77 = vfmadd132ps_fma(auVar199,auVar77,local_740._0_16_);
              auVar215._4_4_ = fVar239;
              auVar215._0_4_ = fVar239;
              auVar215._8_4_ = fVar239;
              auVar215._12_4_ = fVar239;
              auVar77 = vfmadd132ps_fma(auVar215,auVar77,local_700._0_16_);
              auVar159 = vfmadd231ss_fma(auVar75,auVar252,ZEXT416(0x41100000));
              local_600._0_16_ = auVar159;
              local_640 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar252,
                                          ZEXT416(0x40800000));
              local_650 = vfmadd213ss_fma(auVar78,auVar252,ZEXT416(0xbf800000));
              local_5e0._0_16_ = auVar77;
              auVar77 = vsubps_avx(auVar76,auVar77);
              auVar76 = vdpps_avx(auVar77,auVar77,0x7f);
              fVar239 = auVar76._0_4_;
              if (fVar239 < 0.0) {
                auVar253._0_4_ = sqrtf(fVar239);
                auVar253._4_60_ = extraout_var_00;
                auVar84 = ZEXT416(auVar84._0_4_);
                auVar159 = auVar253._0_16_;
              }
              else {
                auVar159 = vsqrtss_avx(auVar76,auVar76);
              }
              auVar79 = vfnmadd231ss_fma(ZEXT416((uint)(fVar251 * (fVar209 + fVar209))),
                                         ZEXT416((uint)fVar209),ZEXT416((uint)fVar209));
              auVar84 = vfmadd213ss_fma(auVar84,ZEXT416((uint)(fVar251 + fVar251)),
                                        ZEXT416((uint)(fVar251 * fVar251 * 3.0)));
              auVar75 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar252,
                                        SUB6416(ZEXT464(0x40000000),0));
              auVar78 = vfmadd231ss_fma(ZEXT416((uint)(fVar209 * fVar209 * -3.0)),
                                        ZEXT416((uint)(fVar209 + fVar209)),auVar75);
              auVar75 = vfmadd213ss_fma(ZEXT416((uint)(fVar209 * -2.0)),auVar252,
                                        ZEXT416((uint)(fVar251 * fVar251)));
              fVar240 = auVar79._0_4_ * 0.5;
              fVar241 = auVar84._0_4_ * 0.5;
              fVar257 = auVar78._0_4_ * 0.5;
              fVar209 = auVar75._0_4_ * 0.5;
              auVar216._0_4_ = fVar209 * (float)local_760._0_4_;
              auVar216._4_4_ = fVar209 * (float)local_760._4_4_;
              auVar216._8_4_ = fVar209 * fStack_758;
              auVar216._12_4_ = fVar209 * fStack_754;
              auVar200._4_4_ = fVar257;
              auVar200._0_4_ = fVar257;
              auVar200._8_4_ = fVar257;
              auVar200._12_4_ = fVar257;
              auVar84 = vfmadd132ps_fma(auVar200,auVar216,local_720._0_16_);
              auVar180._4_4_ = fVar241;
              auVar180._0_4_ = fVar241;
              auVar180._8_4_ = fVar241;
              auVar180._12_4_ = fVar241;
              auVar84 = vfmadd132ps_fma(auVar180,auVar84,local_740._0_16_);
              auVar261._4_4_ = fVar240;
              auVar261._0_4_ = fVar240;
              auVar261._8_4_ = fVar240;
              auVar261._12_4_ = fVar240;
              auVar75 = vfmadd132ps_fma(auVar261,auVar84,local_700._0_16_);
              auVar84 = vdpps_avx(auVar75,auVar75,0x7f);
              auVar51._12_4_ = 0;
              auVar51._0_12_ = ZEXT812(0);
              fVar240 = auVar84._0_4_;
              auVar78 = vrsqrt14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar240));
              fVar241 = auVar78._0_4_;
              auVar79 = vrcp14ss_avx512f(auVar51 << 0x20,ZEXT416((uint)fVar240));
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar80 = vxorps_avx512vl(auVar84,auVar22);
              auVar78 = vfnmadd213ss_fma(auVar79,auVar84,SUB6416(ZEXT464(0x40000000),0));
              uVar73 = auVar159._0_4_;
              if (fVar240 < auVar80._0_4_) {
                fVar257 = sqrtf(fVar240);
                auVar159 = ZEXT416(uVar73);
              }
              else {
                auVar84 = vsqrtss_avx(auVar84,auVar84);
                fVar257 = auVar84._0_4_;
              }
              fVar241 = fVar241 * 1.5 + fVar240 * -0.5 * fVar241 * fVar241 * fVar241;
              auVar160._0_4_ = auVar75._0_4_ * fVar241;
              auVar160._4_4_ = auVar75._4_4_ * fVar241;
              auVar160._8_4_ = auVar75._8_4_ * fVar241;
              auVar160._12_4_ = auVar75._12_4_ * fVar241;
              auVar84 = vdpps_avx(auVar77,auVar160,0x7f);
              fVar242 = auVar159._0_4_;
              auVar161._0_4_ = auVar84._0_4_ * auVar84._0_4_;
              auVar161._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar161._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar161._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar81 = vsubps_avx512vl(auVar76,auVar161);
              fVar209 = auVar81._0_4_;
              auVar181._4_12_ = ZEXT812(0) << 0x20;
              auVar181._0_4_ = fVar209;
              auVar80 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar181);
              auVar82 = vmulss_avx512f(auVar80,ZEXT416(0x3fc00000));
              if (fVar209 < 0.0) {
                local_680 = fVar241;
                fStack_67c = fVar241;
                fStack_678 = fVar241;
                fStack_674 = fVar241;
                local_670 = auVar80;
                local_660 = auVar84;
                fVar153 = sqrtf(fVar209);
                auVar82 = ZEXT416(auVar82._0_4_);
                auVar159 = ZEXT416(uVar73);
                auVar84 = local_660;
                auVar80 = local_670;
                fVar241 = local_680;
                fVar246 = fStack_67c;
                fVar247 = fStack_678;
                fVar248 = fStack_674;
              }
              else {
                auVar81 = vsqrtss_avx(auVar81,auVar81);
                fVar153 = auVar81._0_4_;
                fVar246 = fVar241;
                fVar247 = fVar241;
                fVar248 = fVar241;
              }
              auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar263 = ZEXT3264(auVar99);
              auVar182._0_4_ = (float)local_650._0_4_ * (float)local_760._0_4_;
              auVar182._4_4_ = (float)local_650._0_4_ * (float)local_760._4_4_;
              auVar182._8_4_ = (float)local_650._0_4_ * fStack_758;
              auVar182._12_4_ = (float)local_650._0_4_ * fStack_754;
              auVar201._4_4_ = local_640._0_4_;
              auVar201._0_4_ = local_640._0_4_;
              auVar201._8_4_ = local_640._0_4_;
              auVar201._12_4_ = local_640._0_4_;
              auVar81 = vfmadd132ps_fma(auVar201,auVar182,local_720._0_16_);
              auVar183._4_4_ = local_600._0_4_;
              auVar183._0_4_ = local_600._0_4_;
              auVar183._8_4_ = local_600._0_4_;
              auVar183._12_4_ = local_600._0_4_;
              auVar81 = vfmadd132ps_fma(auVar183,auVar81,local_740._0_16_);
              auVar252 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0400000),0),auVar252,ZEXT416(0x40000000)
                                        );
              auVar202._0_4_ = auVar252._0_4_;
              auVar202._4_4_ = auVar202._0_4_;
              auVar202._8_4_ = auVar202._0_4_;
              auVar202._12_4_ = auVar202._0_4_;
              auVar252 = vfmadd132ps_fma(auVar202,auVar81,local_700._0_16_);
              auVar184._0_4_ = auVar252._0_4_ * fVar240;
              auVar184._4_4_ = auVar252._4_4_ * fVar240;
              auVar184._8_4_ = auVar252._8_4_ * fVar240;
              auVar184._12_4_ = auVar252._12_4_ * fVar240;
              auVar252 = vdpps_avx(auVar75,auVar252,0x7f);
              fVar240 = auVar252._0_4_;
              auVar203._0_4_ = auVar75._0_4_ * fVar240;
              auVar203._4_4_ = auVar75._4_4_ * fVar240;
              auVar203._8_4_ = auVar75._8_4_ * fVar240;
              auVar203._12_4_ = auVar75._12_4_ * fVar240;
              auVar252 = vsubps_avx(auVar184,auVar203);
              local_9e0 = auVar79._0_4_;
              local_9e0 = auVar78._0_4_ * local_9e0;
              auVar79 = vmaxss_avx(ZEXT416((uint)fVar234),
                                   ZEXT416((uint)(fVar238 * fVar237 * 1.9073486e-06)));
              auVar23._8_4_ = 0x80000000;
              auVar23._0_8_ = 0x8000000080000000;
              auVar23._12_4_ = 0x80000000;
              auVar83 = vxorps_avx512vl(auVar75,auVar23);
              auVar204._0_4_ = fVar241 * auVar252._0_4_ * local_9e0;
              auVar204._4_4_ = fVar246 * auVar252._4_4_ * local_9e0;
              auVar204._8_4_ = fVar247 * auVar252._8_4_ * local_9e0;
              auVar204._12_4_ = fVar248 * auVar252._12_4_ * local_9e0;
              auVar259 = ZEXT1664(auVar160);
              auVar78 = vdpps_avx(auVar83,auVar160,0x7f);
              auVar252 = vfmadd213ss_fma(auVar159,ZEXT416((uint)fVar234),auVar79);
              auVar159 = vdpps_avx(auVar77,auVar204,0x7f);
              auVar81 = vfmadd213ss_fma(ZEXT416((uint)(fVar242 + 1.0)),
                                        ZEXT416((uint)(fVar234 / fVar257)),auVar252);
              fVar240 = auVar78._0_4_ + auVar159._0_4_;
              auVar159 = vdpps_avx(local_770,auVar160,0x7f);
              auVar78 = vdpps_avx(auVar77,auVar83,0x7f);
              fVar241 = auVar80._0_4_;
              auVar83 = vaddss_avx512f(auVar82,ZEXT416((uint)(fVar241 * fVar209 * -0.5 *
                                                             fVar241 * fVar241)));
              auVar252 = vdpps_avx(auVar77,local_770,0x7f);
              auVar80 = vfnmadd231ss_fma(auVar78,auVar84,ZEXT416((uint)fVar240));
              auVar82 = vfnmadd231ss_fma(auVar252,auVar84,auVar159);
              auVar78 = vpermilps_avx(local_5e0._0_16_,0xff);
              fVar153 = fVar153 - auVar78._0_4_;
              auVar78 = vshufps_avx(auVar75,auVar75,0xff);
              auVar252 = vfmsub213ss_fma(auVar80,auVar83,auVar78);
              fVar241 = auVar82._0_4_ * auVar83._0_4_;
              auVar80 = vfmsub231ss_fma(ZEXT416((uint)(auVar159._0_4_ * auVar252._0_4_)),
                                        ZEXT416((uint)fVar240),ZEXT416((uint)fVar241));
              fVar257 = auVar80._0_4_;
              fVar241 = auVar84._0_4_ * (fVar241 / fVar257);
              auVar236 = ZEXT464((uint)fVar241);
              fVar251 = fVar251 - (fVar241 - fVar153 * (auVar159._0_4_ / fVar257));
              auVar253 = ZEXT464((uint)fVar251);
              fVar238 = fVar238 - (fVar153 * (fVar240 / fVar257) -
                                  auVar84._0_4_ * (auVar252._0_4_ / fVar257));
              auVar249 = ZEXT464((uint)fVar238);
              auVar228._8_4_ = 0x7fffffff;
              auVar228._0_8_ = 0x7fffffff7fffffff;
              auVar228._12_4_ = 0x7fffffff;
              auVar84 = vandps_avx(auVar84,auVar228);
              bVar71 = true;
              if (auVar84._0_4_ < auVar81._0_4_) {
                auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar81._0_4_ + auVar79._0_4_)),local_6a0,
                                           ZEXT416(0x36000000));
                auVar84 = vandps_avx(ZEXT416((uint)fVar153),auVar228);
                if (auVar84._0_4_ < auVar159._0_4_) {
                  fVar238 = fVar238 + (float)local_690._0_4_;
                  auVar249 = ZEXT464((uint)fVar238);
                  if ((((fVar151 <= fVar238) &&
                       (fVar240 = *(float *)(ray + k * 4 + 0x100), fVar238 <= fVar240)) &&
                      (0.0 <= fVar251)) && (fVar251 <= 1.0)) {
                    auVar142._16_16_ = auVar139._16_16_;
                    auVar142._0_16_ = ZEXT816(0) << 0x20;
                    auVar141._4_28_ = auVar142._4_28_;
                    auVar141._0_4_ = fVar239;
                    auVar84 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar141._0_16_);
                    fVar239 = auVar84._0_4_;
                    auVar76 = vmulss_avx512f(auVar76,ZEXT416(0xbf000000));
                    pGVar3 = (context->scene->geometries).items[uVar63].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
                        bVar66 = true;
                      }
                      else {
                        fVar239 = fVar239 * 1.5 + auVar76._0_4_ * fVar239 * fVar239 * fVar239;
                        auVar185._0_4_ = auVar77._0_4_ * fVar239;
                        auVar185._4_4_ = auVar77._4_4_ * fVar239;
                        auVar185._8_4_ = auVar77._8_4_ * fVar239;
                        auVar185._12_4_ = auVar77._12_4_ * fVar239;
                        auVar159 = vfmadd213ps_fma(auVar78,auVar185,auVar75);
                        auVar76 = vshufps_avx(auVar185,auVar185,0xc9);
                        auVar77 = vshufps_avx(auVar75,auVar75,0xc9);
                        auVar186._0_4_ = auVar185._0_4_ * auVar77._0_4_;
                        auVar186._4_4_ = auVar185._4_4_ * auVar77._4_4_;
                        auVar186._8_4_ = auVar185._8_4_ * auVar77._8_4_;
                        auVar186._12_4_ = auVar185._12_4_ * auVar77._12_4_;
                        auVar84 = vfmsub231ps_fma(auVar186,auVar75,auVar76);
                        auVar76 = vshufps_avx(auVar84,auVar84,0xc9);
                        auVar77 = vshufps_avx(auVar159,auVar159,0xc9);
                        auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                        auVar162._0_4_ = auVar159._0_4_ * auVar84._0_4_;
                        auVar162._4_4_ = auVar159._4_4_ * auVar84._4_4_;
                        auVar162._8_4_ = auVar159._8_4_ * auVar84._8_4_;
                        auVar162._12_4_ = auVar159._12_4_ * auVar84._12_4_;
                        auVar76 = vfmsub231ps_fma(auVar162,auVar76,auVar77);
                        auVar207._8_4_ = 1;
                        auVar207._0_8_ = 0x100000001;
                        auVar207._12_4_ = 1;
                        auVar207._16_4_ = 1;
                        auVar207._20_4_ = 1;
                        auVar207._24_4_ = 1;
                        auVar207._28_4_ = 1;
                        auVar99 = vpermps_avx2(auVar207,ZEXT1632(auVar76));
                        auVar221._8_4_ = 2;
                        auVar221._0_8_ = 0x200000002;
                        auVar221._12_4_ = 2;
                        auVar221._16_4_ = 2;
                        auVar221._20_4_ = 2;
                        auVar221._24_4_ = 2;
                        auVar221._28_4_ = 2;
                        local_440 = vpermps_avx2(auVar221,ZEXT1632(auVar76));
                        local_420 = auVar76._0_4_;
                        local_460[0] = (RTCHitN)auVar99[0];
                        local_460[1] = (RTCHitN)auVar99[1];
                        local_460[2] = (RTCHitN)auVar99[2];
                        local_460[3] = (RTCHitN)auVar99[3];
                        local_460[4] = (RTCHitN)auVar99[4];
                        local_460[5] = (RTCHitN)auVar99[5];
                        local_460[6] = (RTCHitN)auVar99[6];
                        local_460[7] = (RTCHitN)auVar99[7];
                        local_460[8] = (RTCHitN)auVar99[8];
                        local_460[9] = (RTCHitN)auVar99[9];
                        local_460[10] = (RTCHitN)auVar99[10];
                        local_460[0xb] = (RTCHitN)auVar99[0xb];
                        local_460[0xc] = (RTCHitN)auVar99[0xc];
                        local_460[0xd] = (RTCHitN)auVar99[0xd];
                        local_460[0xe] = (RTCHitN)auVar99[0xe];
                        local_460[0xf] = (RTCHitN)auVar99[0xf];
                        local_460[0x10] = (RTCHitN)auVar99[0x10];
                        local_460[0x11] = (RTCHitN)auVar99[0x11];
                        local_460[0x12] = (RTCHitN)auVar99[0x12];
                        local_460[0x13] = (RTCHitN)auVar99[0x13];
                        local_460[0x14] = (RTCHitN)auVar99[0x14];
                        local_460[0x15] = (RTCHitN)auVar99[0x15];
                        local_460[0x16] = (RTCHitN)auVar99[0x16];
                        local_460[0x17] = (RTCHitN)auVar99[0x17];
                        local_460[0x18] = (RTCHitN)auVar99[0x18];
                        local_460[0x19] = (RTCHitN)auVar99[0x19];
                        local_460[0x1a] = (RTCHitN)auVar99[0x1a];
                        local_460[0x1b] = (RTCHitN)auVar99[0x1b];
                        local_460[0x1c] = (RTCHitN)auVar99[0x1c];
                        local_460[0x1d] = (RTCHitN)auVar99[0x1d];
                        local_460[0x1e] = (RTCHitN)auVar99[0x1e];
                        local_460[0x1f] = (RTCHitN)auVar99[0x1f];
                        uStack_41c = local_420;
                        uStack_418 = local_420;
                        uStack_414 = local_420;
                        uStack_410 = local_420;
                        uStack_40c = local_420;
                        uStack_408 = local_420;
                        uStack_404 = local_420;
                        local_400 = fVar251;
                        fStack_3fc = fVar251;
                        fStack_3f8 = fVar251;
                        fStack_3f4 = fVar251;
                        fStack_3f0 = fVar251;
                        fStack_3ec = fVar251;
                        fStack_3e8 = fVar251;
                        fStack_3e4 = fVar251;
                        local_3e0 = ZEXT432(0) << 0x20;
                        local_3c0 = local_4e0._0_8_;
                        uStack_3b8 = local_4e0._8_8_;
                        uStack_3b0 = local_4e0._16_8_;
                        uStack_3a8 = local_4e0._24_8_;
                        local_3a0 = local_500;
                        vpcmpeqd_avx2(local_500,local_500);
                        local_380 = context->user->instID[0];
                        uStack_37c = local_380;
                        uStack_378 = local_380;
                        uStack_374 = local_380;
                        uStack_370 = local_380;
                        uStack_36c = local_380;
                        uStack_368 = local_380;
                        uStack_364 = local_380;
                        local_360 = context->user->instPrimID[0];
                        uStack_35c = local_360;
                        uStack_358 = local_360;
                        uStack_354 = local_360;
                        uStack_350 = local_360;
                        uStack_34c = local_360;
                        uStack_348 = local_360;
                        uStack_344 = local_360;
                        *(float *)(ray + k * 4 + 0x100) = fVar238;
                        local_6e0 = local_520._0_8_;
                        uStack_6d8 = local_520._8_8_;
                        uStack_6d0 = local_520._16_8_;
                        uStack_6c8 = local_520._24_8_;
                        local_7b0.valid = (int *)&local_6e0;
                        local_7b0.geometryUserPtr = pGVar3->userPtr;
                        local_7b0.context = context->user;
                        local_7b0.hit = local_460;
                        local_7b0.N = 8;
                        local_7b0.ray = (RTCRayN *)ray;
                        if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                          auVar236 = ZEXT464((uint)fVar241);
                          auVar259 = ZEXT1664(auVar160);
                          (*pGVar3->occlusionFilterN)(&local_7b0);
                          auVar249 = ZEXT1664(ZEXT416((uint)fVar238));
                          auVar253 = ZEXT1664(ZEXT416((uint)fVar251));
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                          auVar263 = ZEXT3264(auVar99);
                        }
                        auVar54._8_8_ = uStack_6d8;
                        auVar54._0_8_ = local_6e0;
                        auVar54._16_8_ = uStack_6d0;
                        auVar54._24_8_ = uStack_6c8;
                        if (auVar54 == (undefined1  [32])0x0) {
                          bVar66 = false;
                        }
                        else {
                          p_Var7 = context->args->filter;
                          if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                             (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                               RTC_RAY_QUERY_FLAG_INCOHERENT ||
                              (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                            auVar236 = ZEXT1664(auVar236._0_16_);
                            auVar259 = ZEXT1664(auVar259._0_16_);
                            (*p_Var7)(&local_7b0);
                            auVar249 = ZEXT1664(ZEXT416((uint)fVar238));
                            auVar253 = ZEXT1664(ZEXT416((uint)fVar251));
                            auVar99 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                            auVar263 = ZEXT3264(auVar99);
                          }
                          auVar55._8_8_ = uStack_6d8;
                          auVar55._0_8_ = local_6e0;
                          auVar55._16_8_ = uStack_6d0;
                          auVar55._24_8_ = uStack_6c8;
                          uVar72 = vptestmd_avx512vl(auVar55,auVar55);
                          auVar99 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                          bVar71 = (bool)((byte)uVar72 & 1);
                          bVar8 = (bool)((byte)(uVar72 >> 1) & 1);
                          bVar9 = (bool)((byte)(uVar72 >> 2) & 1);
                          bVar10 = (bool)((byte)(uVar72 >> 3) & 1);
                          bVar11 = (bool)((byte)(uVar72 >> 4) & 1);
                          bVar12 = (bool)((byte)(uVar72 >> 5) & 1);
                          bVar13 = (bool)((byte)(uVar72 >> 6) & 1);
                          bVar14 = SUB81(uVar72 >> 7,0);
                          *(uint *)(local_7b0.ray + 0x100) =
                               (uint)bVar71 * auVar99._0_4_ |
                               (uint)!bVar71 * *(int *)(local_7b0.ray + 0x100);
                          *(uint *)(local_7b0.ray + 0x104) =
                               (uint)bVar8 * auVar99._4_4_ |
                               (uint)!bVar8 * *(int *)(local_7b0.ray + 0x104);
                          *(uint *)(local_7b0.ray + 0x108) =
                               (uint)bVar9 * auVar99._8_4_ |
                               (uint)!bVar9 * *(int *)(local_7b0.ray + 0x108);
                          *(uint *)(local_7b0.ray + 0x10c) =
                               (uint)bVar10 * auVar99._12_4_ |
                               (uint)!bVar10 * *(int *)(local_7b0.ray + 0x10c);
                          *(uint *)(local_7b0.ray + 0x110) =
                               (uint)bVar11 * auVar99._16_4_ |
                               (uint)!bVar11 * *(int *)(local_7b0.ray + 0x110);
                          *(uint *)(local_7b0.ray + 0x114) =
                               (uint)bVar12 * auVar99._20_4_ |
                               (uint)!bVar12 * *(int *)(local_7b0.ray + 0x114);
                          *(uint *)(local_7b0.ray + 0x118) =
                               (uint)bVar13 * auVar99._24_4_ |
                               (uint)!bVar13 * *(int *)(local_7b0.ray + 0x118);
                          *(uint *)(local_7b0.ray + 0x11c) =
                               (uint)bVar14 * auVar99._28_4_ |
                               (uint)!bVar14 * *(int *)(local_7b0.ray + 0x11c);
                          bVar66 = auVar55 != (undefined1  [32])0x0;
                        }
                        if ((bool)bVar66 == false) {
                          *(float *)(ray + k * 4 + 0x100) = fVar240;
                        }
                      }
                      bVar71 = false;
                      goto LAB_01f1477b;
                    }
                  }
                  bVar71 = false;
                  bVar66 = 0;
                }
              }
LAB_01f1477b:
              if (!bVar71) goto LAB_01f14b58;
              lVar70 = lVar70 + -1;
            } while (lVar70 != 0);
            bVar66 = 0;
LAB_01f14b58:
            bVar68 = bVar68 | bVar66 & 1;
            auVar57._4_4_ = fStack_57c;
            auVar57._0_4_ = local_580;
            auVar57._8_4_ = fStack_578;
            auVar57._12_4_ = fStack_574;
            auVar57._16_4_ = fStack_570;
            auVar57._20_4_ = fStack_56c;
            auVar57._24_4_ = fStack_568;
            auVar57._28_4_ = fStack_564;
            uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar32._4_4_ = uVar152;
            auVar32._0_4_ = uVar152;
            auVar32._8_4_ = uVar152;
            auVar32._12_4_ = uVar152;
            auVar32._16_4_ = uVar152;
            auVar32._20_4_ = uVar152;
            auVar32._24_4_ = uVar152;
            auVar32._28_4_ = uVar152;
            uVar16 = vcmpps_avx512vl(auVar57,auVar32,2);
            bVar67 = bVar69 & bVar67 & (byte)uVar16;
          } while (bVar67 != 0);
        }
        uVar18 = vpcmpd_avx512vl(local_4c0,_local_5a0,1);
        uVar17 = vpcmpd_avx512vl(local_4c0,local_300,1);
        auVar188._0_4_ = (float)local_5c0._0_4_ + (float)local_1c0._0_4_;
        auVar188._4_4_ = (float)local_5c0._4_4_ + (float)local_1c0._4_4_;
        auVar188._8_4_ = fStack_5b8 + fStack_1b8;
        auVar188._12_4_ = fStack_5b4 + fStack_1b4;
        auVar188._16_4_ = fStack_5b0 + fStack_1b0;
        auVar188._20_4_ = fStack_5ac + fStack_1ac;
        auVar188._24_4_ = fStack_5a8 + fStack_1a8;
        auVar188._28_4_ = fStack_5a4 + fStack_1a4;
        uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar208._4_4_ = uVar152;
        auVar208._0_4_ = uVar152;
        auVar208._8_4_ = uVar152;
        auVar208._12_4_ = uVar152;
        auVar208._16_4_ = uVar152;
        auVar208._20_4_ = uVar152;
        auVar208._24_4_ = uVar152;
        auVar208._28_4_ = uVar152;
        uVar16 = vcmpps_avx512vl(auVar188,auVar208,2);
        bVar61 = bVar61 & (byte)uVar17 & (byte)uVar16;
        auVar222._0_4_ = (float)local_5c0._0_4_ + (float)local_340._0_4_;
        auVar222._4_4_ = (float)local_5c0._4_4_ + (float)local_340._4_4_;
        auVar222._8_4_ = fStack_5b8 + fStack_338;
        auVar222._12_4_ = fStack_5b4 + fStack_334;
        auVar222._16_4_ = fStack_5b0 + fStack_330;
        auVar222._20_4_ = fStack_5ac + fStack_32c;
        auVar222._24_4_ = fStack_5a8 + fStack_328;
        auVar222._28_4_ = fStack_5a4 + fStack_324;
        uVar16 = vcmpps_avx512vl(auVar222,auVar208,2);
        bVar59 = bVar59 & (byte)uVar18 & (byte)uVar16 | bVar61;
        if (bVar59 != 0) {
          abStack_180[uVar62 * 0x60] = bVar59;
          bVar71 = (bool)(bVar61 >> 1 & 1);
          bVar8 = (bool)(bVar61 >> 2 & 1);
          bVar9 = (bool)(bVar61 >> 3 & 1);
          bVar10 = (bool)(bVar61 >> 4 & 1);
          bVar11 = (bool)(bVar61 >> 5 & 1);
          auStack_160[uVar62 * 0x18] =
               (uint)(bVar61 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar61 & 1) * local_340._0_4_;
          auStack_160[uVar62 * 0x18 + 1] =
               (uint)bVar71 * local_1c0._4_4_ | (uint)!bVar71 * local_340._4_4_;
          auStack_160[uVar62 * 0x18 + 2] =
               (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)fStack_338;
          auStack_160[uVar62 * 0x18 + 3] =
               (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_334;
          auStack_160[uVar62 * 0x18 + 4] =
               (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_330;
          auStack_160[uVar62 * 0x18 + 5] =
               (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)fStack_32c;
          auStack_160[uVar62 * 0x18 + 6] =
               (uint)(bVar61 >> 6) * (int)fStack_1a8 | (uint)!(bool)(bVar61 >> 6) * (int)fStack_328;
          (&fStack_144)[uVar62 * 0x18] = fStack_324;
          uVar16 = vmovlps_avx(local_6b0);
          (&uStack_140)[uVar62 * 0xc] = uVar16;
          afStack_138[uVar62 * 0x18] = (float)((int)fVar210 + 1);
          uVar62 = (ulong)((int)uVar62 + 1);
          goto LAB_01f14c4f;
        }
        auVar223 = ZEXT3264(CONCAT428(0x3f800000,
                                      CONCAT424(0x3f800000,
                                                CONCAT420(0x3f800000,
                                                          CONCAT416(0x3f800000,
                                                                    CONCAT412(0x3f800000,
                                                                              CONCAT48(0x3f800000,
                                                                                       &
                                                  DAT_3f8000003f800000)))))));
      }
    }
    do {
      if ((int)uVar62 == 0) {
        if (bVar68 != 0) {
          return local_ab9;
        }
        uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
        auVar34._4_4_ = uVar152;
        auVar34._0_4_ = uVar152;
        auVar34._8_4_ = uVar152;
        auVar34._12_4_ = uVar152;
        auVar34._16_4_ = uVar152;
        auVar34._20_4_ = uVar152;
        auVar34._24_4_ = uVar152;
        auVar34._28_4_ = uVar152;
        uVar16 = vcmpps_avx512vl(local_2e0,auVar34,2);
        uVar63 = (uint)uVar16 & (uint)local_628 - 1 & (uint)local_628;
        local_628 = (ulong)uVar63;
        local_ab9 = uVar63 != 0;
        if (!local_ab9) {
          return local_ab9;
        }
        goto LAB_01f1235c;
      }
      uVar65 = (ulong)((int)uVar62 - 1);
      auVar99 = *(undefined1 (*) [32])(auStack_160 + uVar65 * 0x18);
      auVar189._0_4_ = auVar99._0_4_ + (float)local_5c0._0_4_;
      auVar189._4_4_ = auVar99._4_4_ + (float)local_5c0._4_4_;
      auVar189._8_4_ = auVar99._8_4_ + fStack_5b8;
      auVar189._12_4_ = auVar99._12_4_ + fStack_5b4;
      auVar189._16_4_ = auVar99._16_4_ + fStack_5b0;
      auVar189._20_4_ = auVar99._20_4_ + fStack_5ac;
      auVar189._24_4_ = auVar99._24_4_ + fStack_5a8;
      auVar189._28_4_ = auVar99._28_4_ + fStack_5a4;
      uVar152 = *(undefined4 *)(ray + k * 4 + 0x100);
      auVar33._4_4_ = uVar152;
      auVar33._0_4_ = uVar152;
      auVar33._8_4_ = uVar152;
      auVar33._12_4_ = uVar152;
      auVar33._16_4_ = uVar152;
      auVar33._20_4_ = uVar152;
      auVar33._24_4_ = uVar152;
      auVar33._28_4_ = uVar152;
      uVar16 = vcmpps_avx512vl(auVar189,auVar33,2);
      uVar73 = (uint)uVar16 & (uint)abStack_180[uVar65 * 0x60];
      bVar59 = (byte)uVar73;
      uVar72 = uVar65;
      if (uVar73 != 0) {
        auVar190._8_4_ = 0x7f800000;
        auVar190._0_8_ = 0x7f8000007f800000;
        auVar190._12_4_ = 0x7f800000;
        auVar190._16_4_ = 0x7f800000;
        auVar190._20_4_ = 0x7f800000;
        auVar190._24_4_ = 0x7f800000;
        auVar190._28_4_ = 0x7f800000;
        auVar85 = vblendmps_avx512vl(auVar190,auVar99);
        auVar143._0_4_ =
             (uint)(bVar59 & 1) * auVar85._0_4_ | (uint)!(bool)(bVar59 & 1) * (int)auVar99._0_4_;
        bVar71 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar143._4_4_ = (uint)bVar71 * auVar85._4_4_ | (uint)!bVar71 * (int)auVar99._4_4_;
        bVar71 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar143._8_4_ = (uint)bVar71 * auVar85._8_4_ | (uint)!bVar71 * (int)auVar99._8_4_;
        bVar71 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar143._12_4_ = (uint)bVar71 * auVar85._12_4_ | (uint)!bVar71 * (int)auVar99._12_4_;
        bVar71 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar143._16_4_ = (uint)bVar71 * auVar85._16_4_ | (uint)!bVar71 * (int)auVar99._16_4_;
        bVar71 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar143._20_4_ = (uint)bVar71 * auVar85._20_4_ | (uint)!bVar71 * (int)auVar99._20_4_;
        bVar71 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar143._24_4_ = (uint)bVar71 * auVar85._24_4_ | (uint)!bVar71 * (int)auVar99._24_4_;
        auVar143._28_4_ =
             (uVar73 >> 7) * auVar85._28_4_ | (uint)!SUB41(uVar73 >> 7,0) * (int)auVar99._28_4_;
        auVar99 = vshufps_avx(auVar143,auVar143,0xb1);
        auVar99 = vminps_avx(auVar143,auVar99);
        auVar85 = vshufpd_avx(auVar99,auVar99,5);
        auVar99 = vminps_avx(auVar99,auVar85);
        auVar85 = vpermpd_avx2(auVar99,0x4e);
        auVar99 = vminps_avx(auVar99,auVar85);
        uVar16 = vcmpps_avx512vl(auVar143,auVar99,0);
        bVar67 = (byte)uVar16 & bVar59;
        if (bVar67 != 0) {
          uVar73 = (uint)bVar67;
        }
        fVar234 = afStack_138[uVar65 * 0x18 + -1];
        uVar144 = 0;
        for (; (uVar73 & 1) == 0; uVar73 = uVar73 >> 1 | 0x80000000) {
          uVar144 = uVar144 + 1;
        }
        fVar210 = afStack_138[uVar65 * 0x18];
        bVar67 = ~('\x01' << ((byte)uVar144 & 0x1f)) & bVar59;
        abStack_180[uVar65 * 0x60] = bVar67;
        if (bVar67 != 0) {
          uVar72 = uVar62;
        }
        fVar237 = *(float *)(&uStack_140 + uVar65 * 0xc);
        auVar191._4_4_ = fVar237;
        auVar191._0_4_ = fVar237;
        auVar191._8_4_ = fVar237;
        auVar191._12_4_ = fVar237;
        auVar191._16_4_ = fVar237;
        auVar191._20_4_ = fVar237;
        auVar191._24_4_ = fVar237;
        auVar191._28_4_ = fVar237;
        fVar234 = fVar234 - fVar237;
        auVar172._4_4_ = fVar234;
        auVar172._0_4_ = fVar234;
        auVar172._8_4_ = fVar234;
        auVar172._12_4_ = fVar234;
        auVar172._16_4_ = fVar234;
        auVar172._20_4_ = fVar234;
        auVar172._24_4_ = fVar234;
        auVar172._28_4_ = fVar234;
        auVar76 = vfmadd132ps_fma(auVar172,auVar191,_DAT_02020f20);
        auVar99 = ZEXT1632(auVar76);
        local_460[0] = (RTCHitN)auVar99[0];
        local_460[1] = (RTCHitN)auVar99[1];
        local_460[2] = (RTCHitN)auVar99[2];
        local_460[3] = (RTCHitN)auVar99[3];
        local_460[4] = (RTCHitN)auVar99[4];
        local_460[5] = (RTCHitN)auVar99[5];
        local_460[6] = (RTCHitN)auVar99[6];
        local_460[7] = (RTCHitN)auVar99[7];
        local_460[8] = (RTCHitN)auVar99[8];
        local_460[9] = (RTCHitN)auVar99[9];
        local_460[10] = (RTCHitN)auVar99[10];
        local_460[0xb] = (RTCHitN)auVar99[0xb];
        local_460[0xc] = (RTCHitN)auVar99[0xc];
        local_460[0xd] = (RTCHitN)auVar99[0xd];
        local_460[0xe] = (RTCHitN)auVar99[0xe];
        local_460[0xf] = (RTCHitN)auVar99[0xf];
        local_460[0x10] = (RTCHitN)auVar99[0x10];
        local_460[0x11] = (RTCHitN)auVar99[0x11];
        local_460[0x12] = (RTCHitN)auVar99[0x12];
        local_460[0x13] = (RTCHitN)auVar99[0x13];
        local_460[0x14] = (RTCHitN)auVar99[0x14];
        local_460[0x15] = (RTCHitN)auVar99[0x15];
        local_460[0x16] = (RTCHitN)auVar99[0x16];
        local_460[0x17] = (RTCHitN)auVar99[0x17];
        local_460[0x18] = (RTCHitN)auVar99[0x18];
        local_460[0x19] = (RTCHitN)auVar99[0x19];
        local_460[0x1a] = (RTCHitN)auVar99[0x1a];
        local_460[0x1b] = (RTCHitN)auVar99[0x1b];
        local_460[0x1c] = (RTCHitN)auVar99[0x1c];
        local_460[0x1d] = (RTCHitN)auVar99[0x1d];
        local_460[0x1e] = (RTCHitN)auVar99[0x1e];
        local_460[0x1f] = (RTCHitN)auVar99[0x1f];
        local_6b0._8_8_ = 0;
        local_6b0._0_8_ = *(ulong *)(local_460 + (ulong)uVar144 * 4);
      }
      uVar62 = uVar72;
    } while (bVar59 == 0);
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }